

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>::
occluded(BVHNIntersector1<4,_16777232,_true,_embree::sse42::SubGridMBIntersector1Pluecker<4,_true>_>
         *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  undefined8 *puVar15;
  float *pfVar16;
  float *pfVar17;
  Collider CVar18;
  undefined1 auVar19 [16];
  ushort uVar20;
  ushort uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  undefined1 auVar36 [16];
  byte bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  byte bVar40;
  int iVar41;
  AABBNodeMB4D *node1;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  long lVar45;
  undefined8 uVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  byte bVar58;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  byte bVar76;
  byte bVar77;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar78;
  uint uVar91;
  uint uVar92;
  vint4 ai;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar93;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  uint uVar95;
  uint uVar101;
  uint uVar102;
  vint4 ai_2;
  uint uVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  uint uVar104;
  uint uVar108;
  uint uVar109;
  vint4 bi;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  uint uVar110;
  vint4 ai_5;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  float fVar124;
  float fVar126;
  vint4 ai_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar127;
  undefined1 auVar123 [16];
  float fVar128;
  uint uVar129;
  uint uVar135;
  uint uVar136;
  vint4 bi_1;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  uint uVar137;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar138;
  float fVar140;
  float fVar148;
  float fVar150;
  vint4 ai_7;
  float fVar139;
  float fVar151;
  undefined1 auVar141 [16];
  float fVar149;
  float fVar152;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar153;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar158 [16];
  float fVar162;
  float fVar166;
  float fVar170;
  undefined1 auVar159 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [12];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  vint4 bi_4;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  vint4 bi_2;
  float fVar180;
  float fVar184;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_cbd;
  int local_cbc;
  undefined8 local_cb8;
  float fStack_cb0;
  float fStack_cac;
  float local_ca8;
  float fStack_ca4;
  float fStack_ca0;
  float fStack_c9c;
  undefined8 local_c98;
  float fStack_c90;
  float fStack_c8c;
  undefined8 local_c88;
  float fStack_c80;
  float fStack_c7c;
  long local_c78;
  ulong local_c70;
  ulong *local_c68;
  Intersectors *local_c60;
  undefined1 local_c58 [8];
  float fStack_c50;
  float fStack_c4c;
  ulong local_c40;
  float local_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  undefined1 local_c28 [8];
  float fStack_c20;
  float fStack_c1c;
  Ray *local_c10;
  undefined4 local_c08;
  undefined4 local_c04;
  undefined4 local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined4 local_be8;
  int *local_bd8;
  undefined8 local_bd0;
  undefined4 *local_bc8;
  Intersectors *local_bc0;
  undefined4 *local_bb8;
  undefined4 local_bb0;
  ulong local_ba8;
  long local_ba0;
  long local_b98;
  long local_b90;
  undefined8 local_b88;
  float fStack_b80;
  float fStack_b7c;
  undefined1 local_b78 [16];
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  undefined1 local_b58 [8];
  float fStack_b50;
  float fStack_b4c;
  undefined1 local_b48 [8];
  float fStack_b40;
  float fStack_b3c;
  undefined1 local_b38 [8];
  float fStack_b30;
  float fStack_b2c;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  RayQueryContext *local_af0;
  ulong local_ae8;
  RayQueryContext *local_ae0;
  undefined1 local_ad8 [8];
  float fStack_ad0;
  float fStack_acc;
  undefined1 local_ac8 [8];
  float fStack_ac0;
  float fStack_abc;
  undefined1 local_ab8 [16];
  undefined1 *local_aa8;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_9a8;
  float fStack_9a4;
  float fStack_9a0;
  float fStack_99c;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 local_8b8;
  float fStack_8b0;
  float fStack_8ac;
  undefined8 local_8a8;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined1 local_868 [16];
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  undefined1 local_7f8 [16];
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar168 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar168)) {
    local_c68 = local_7d0;
    local_7d8 = *(ulong *)(*(long *)this + 0x70);
    fVar152 = *(float *)&This->ptr;
    fVar170 = *(float *)((long)&This->ptr + 4);
    local_878 = *(float *)&This->leafIntersector;
    fVar78 = *(float *)((long)&This->leafIntersector + 4);
    CVar18 = This->collider;
    auVar182._4_4_ = -(uint)(ABS(CVar18.collide._4_4_) < 1e-18);
    auVar182._0_4_ = -(uint)(ABS(CVar18.collide._0_4_) < 1e-18);
    auVar182._8_4_ = -(uint)(ABS(CVar18.name._0_4_) < 1e-18);
    auVar182._12_4_ = -(uint)(ABS(CVar18.name._4_4_) < 1e-18);
    local_888 = 0.0;
    if (0.0 <= fVar78) {
      local_888 = fVar78;
    }
    auVar181 = divps(_DAT_01f7ba10,(undefined1  [16])CVar18);
    auVar182 = blendvps(auVar181,_DAT_01fab950,auVar182);
    fVar119 = auVar182._0_4_ * 0.99999964;
    fVar124 = auVar182._4_4_ * 0.99999964;
    fVar126 = auVar182._8_4_ * 0.99999964;
    fVar180 = auVar182._0_4_ * 1.0000004;
    fVar184 = auVar182._4_4_ * 1.0000004;
    local_898 = auVar182._8_4_ * 1.0000004;
    local_c70 = (ulong)(fVar119 < 0.0) << 4;
    uVar52 = (ulong)(fVar124 < 0.0) << 4 | 0x20;
    uVar49 = (ulong)(fVar126 < 0.0) << 4 | 0x40;
    uVar53 = local_c70 ^ 0x10;
    local_868._4_4_ = fVar168;
    local_868._0_4_ = fVar168;
    local_868._8_4_ = fVar168;
    local_868._12_4_ = fVar168;
    local_988 = mm_lookupmask_ps._240_16_;
    local_928 = fVar126;
    fStack_924 = fVar126;
    fStack_920 = fVar126;
    fStack_91c = fVar126;
    local_938 = fVar152;
    fStack_934 = fVar152;
    fStack_930 = fVar152;
    fStack_92c = fVar152;
    local_948 = fVar170;
    fStack_944 = fVar170;
    fStack_940 = fVar170;
    fStack_93c = fVar170;
    local_958 = fVar119;
    fStack_954 = fVar119;
    fStack_950 = fVar119;
    fStack_94c = fVar119;
    local_968 = fVar124;
    fStack_964 = fVar124;
    fStack_960 = fVar124;
    fStack_95c = fVar124;
    local_908 = fVar180;
    fStack_904 = fVar180;
    fStack_900 = fVar180;
    fStack_8fc = fVar180;
    local_918 = fVar184;
    fStack_914 = fVar184;
    fStack_910 = fVar184;
    fStack_90c = fVar184;
    local_c10 = ray;
    local_c60 = This;
    fStack_884 = local_888;
    fStack_880 = local_888;
    fStack_87c = local_888;
    fVar168 = fVar170;
    fVar78 = fVar170;
    fVar128 = fVar170;
    fVar150 = fVar119;
    fVar153 = fVar119;
    fVar140 = fVar119;
    fVar154 = fVar124;
    fVar160 = fVar124;
    fVar163 = fVar124;
    fVar94 = fVar152;
    fVar138 = fVar152;
    fVar148 = fVar152;
    fVar167 = fVar126;
    fVar125 = fVar126;
    fVar127 = fVar126;
    fVar151 = fVar180;
    fVar139 = fVar180;
    fVar149 = fVar180;
    fVar155 = fVar184;
    fVar156 = fVar184;
    fVar157 = fVar184;
    fStack_874 = local_878;
    fStack_870 = local_878;
    fStack_86c = local_878;
    fStack_894 = local_898;
    fStack_890 = local_898;
    fStack_88c = local_898;
    do {
      uVar54 = local_c68[-1];
      local_c68 = local_c68 + -1;
      while ((uVar54 & 8) == 0) {
        fVar161 = *(float *)((long)&(local_c60->collider).name + 4);
        uVar42 = uVar54 & 0xfffffffffffffff0;
        pfVar17 = (float *)(uVar42 + 0x80 + local_c70);
        pfVar16 = (float *)(uVar42 + 0x20 + local_c70);
        auVar122._0_4_ = ((*pfVar17 * fVar161 + *pfVar16) - fVar152) * fVar119;
        auVar122._4_4_ = ((pfVar17[1] * fVar161 + pfVar16[1]) - fVar94) * fVar150;
        auVar122._8_4_ = ((pfVar17[2] * fVar161 + pfVar16[2]) - fVar138) * fVar153;
        auVar122._12_4_ = ((pfVar17[3] * fVar161 + pfVar16[3]) - fVar148) * fVar140;
        pfVar17 = (float *)(uVar42 + 0x80 + uVar52);
        pfVar16 = (float *)(uVar42 + 0x20 + uVar52);
        auVar144._0_4_ = ((*pfVar17 * fVar161 + *pfVar16) - fVar170) * fVar124;
        auVar144._4_4_ = ((pfVar17[1] * fVar161 + pfVar16[1]) - fVar168) * fVar154;
        auVar144._8_4_ = ((pfVar17[2] * fVar161 + pfVar16[2]) - fVar78) * fVar160;
        auVar144._12_4_ = ((pfVar17[3] * fVar161 + pfVar16[3]) - fVar128) * fVar163;
        pfVar17 = (float *)(uVar42 + 0x80 + uVar49);
        pfVar16 = (float *)(uVar42 + 0x20 + uVar49);
        auVar181._0_4_ = ((*pfVar17 * fVar161 + *pfVar16) - local_878) * fVar126;
        auVar181._4_4_ = ((pfVar17[1] * fVar161 + pfVar16[1]) - fStack_874) * fVar167;
        auVar181._8_4_ = ((pfVar17[2] * fVar161 + pfVar16[2]) - fStack_870) * fVar125;
        auVar181._12_4_ = ((pfVar17[3] * fVar161 + pfVar16[3]) - fStack_86c) * fVar127;
        auVar181 = maxps(auVar144,auVar181);
        auVar112._4_4_ = fStack_884;
        auVar112._0_4_ = local_888;
        auVar112._8_4_ = fStack_880;
        auVar112._12_4_ = fStack_87c;
        auVar182 = maxps(auVar112,auVar122);
        auVar182 = maxps(auVar182,auVar181);
        pfVar17 = (float *)(uVar42 + 0x80 + uVar53);
        pfVar16 = (float *)(uVar42 + 0x20 + uVar53);
        auVar105._0_4_ = ((*pfVar17 * fVar161 + *pfVar16) - fVar152) * fVar180;
        auVar105._4_4_ = ((pfVar17[1] * fVar161 + pfVar16[1]) - fVar94) * fVar151;
        auVar105._8_4_ = ((pfVar17[2] * fVar161 + pfVar16[2]) - fVar138) * fVar139;
        auVar105._12_4_ = ((pfVar17[3] * fVar161 + pfVar16[3]) - fVar148) * fVar149;
        pfVar17 = (float *)(uVar42 + 0x80 + (uVar52 ^ 0x10));
        pfVar16 = (float *)(uVar42 + 0x20 + (uVar52 ^ 0x10));
        auVar111._0_4_ = ((*pfVar17 * fVar161 + *pfVar16) - fVar170) * fVar184;
        auVar111._4_4_ = ((pfVar17[1] * fVar161 + pfVar16[1]) - fVar168) * fVar155;
        auVar111._8_4_ = ((pfVar17[2] * fVar161 + pfVar16[2]) - fVar78) * fVar156;
        auVar111._12_4_ = ((pfVar17[3] * fVar161 + pfVar16[3]) - fVar128) * fVar157;
        pfVar17 = (float *)(uVar42 + 0x80 + (uVar49 ^ 0x10));
        pfVar16 = (float *)(uVar42 + 0x20 + (uVar49 ^ 0x10));
        auVar131._0_4_ = ((*pfVar17 * fVar161 + *pfVar16) - local_878) * local_898;
        auVar131._4_4_ = ((pfVar17[1] * fVar161 + pfVar16[1]) - fStack_874) * fStack_894;
        auVar131._8_4_ = ((pfVar17[2] * fVar161 + pfVar16[2]) - fStack_870) * fStack_890;
        auVar131._12_4_ = ((pfVar17[3] * fVar161 + pfVar16[3]) - fStack_86c) * fStack_88c;
        auVar112 = minps(auVar111,auVar131);
        auVar181 = minps(local_868,auVar105);
        auVar181 = minps(auVar181,auVar112);
        bVar25 = auVar182._0_4_ <= auVar181._0_4_;
        bVar26 = auVar182._4_4_ <= auVar181._4_4_;
        bVar27 = auVar182._8_4_ <= auVar181._8_4_;
        bVar28 = auVar182._12_4_ <= auVar181._12_4_;
        if (((uint)uVar54 & 7) == 6) {
          bVar25 = (fVar161 < *(float *)(uVar42 + 0xf0) && *(float *)(uVar42 + 0xe0) <= fVar161) &&
                   bVar25;
          bVar26 = (fVar161 < *(float *)(uVar42 + 0xf4) && *(float *)(uVar42 + 0xe4) <= fVar161) &&
                   bVar26;
          bVar27 = (fVar161 < *(float *)(uVar42 + 0xf8) && *(float *)(uVar42 + 0xe8) <= fVar161) &&
                   bVar27;
          bVar28 = (fVar161 < *(float *)(uVar42 + 0xfc) && *(float *)(uVar42 + 0xec) <= fVar161) &&
                   bVar28;
        }
        auVar79._0_4_ = (uint)bVar25 * -0x80000000;
        auVar79._4_4_ = (uint)bVar26 * -0x80000000;
        auVar79._8_4_ = (uint)bVar27 * -0x80000000;
        auVar79._12_4_ = (uint)bVar28 * -0x80000000;
        uVar44 = movmskps((int)context,auVar79);
        local_af0 = (RayQueryContext *)(ulong)uVar44;
        if (uVar44 == 0) goto LAB_0022eb70;
        context = (RayQueryContext *)(ulong)(byte)uVar44;
        lVar50 = 0;
        if (context != (RayQueryContext *)0x0) {
          for (; ((byte)uVar44 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
          }
        }
        uVar54 = *(ulong *)(uVar42 + lVar50 * 8);
        uVar44 = (uVar44 & 0xff) - 1 & uVar44 & 0xff;
        if (uVar44 != 0) {
          *local_c68 = uVar54;
          local_c68 = local_c68 + 1;
          lVar50 = 0;
          if (uVar44 != 0) {
            for (; (uVar44 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
            }
          }
          uVar54 = *(ulong *)(uVar42 + lVar50 * 8);
          uVar44 = uVar44 - 1 & uVar44;
          context = (RayQueryContext *)(ulong)uVar44;
          if (uVar44 != 0) {
            do {
              *local_c68 = uVar54;
              local_c68 = local_c68 + 1;
              lVar50 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; ((ulong)context >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              uVar54 = *(ulong *)(uVar42 + lVar50 * 8);
              context = (RayQueryContext *)((ulong)context & (ulong)((long)&context[-1].args + 7U));
            } while (context != (RayQueryContext *)0x0);
          }
        }
      }
      local_af0 = (RayQueryContext *)((ulong)((uint)uVar54 & 0xf) - 8);
      if (local_af0 != (RayQueryContext *)0x0) {
        uVar54 = uVar54 & 0xfffffffffffffff0;
        local_ae0 = (RayQueryContext *)0x0;
        do {
          lVar50 = (long)local_ae0 * 0x90;
          fVar94 = (*(float *)((long)&(local_c60->collider).name + 4) -
                   *(float *)(uVar54 + 0x80 + lVar50)) * *(float *)(uVar54 + 0x84 + lVar50);
          uVar42 = *(ulong *)(uVar54 + 0x20 + lVar50);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar42;
          uVar47 = *(ulong *)(uVar54 + 0x24 + lVar50);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = uVar47;
          bVar40 = (byte)uVar47;
          bVar58 = (byte)uVar42;
          bVar29 = (byte)(uVar47 >> 8);
          bVar72 = (byte)(uVar42 >> 8);
          bVar30 = (byte)(uVar47 >> 0x10);
          bVar73 = (byte)(uVar42 >> 0x10);
          bVar31 = (byte)(uVar47 >> 0x18);
          bVar74 = (byte)(uVar42 >> 0x18);
          bVar32 = (byte)(uVar47 >> 0x20);
          bVar75 = (byte)(uVar42 >> 0x20);
          bVar33 = (byte)(uVar47 >> 0x28);
          bVar76 = (byte)(uVar42 >> 0x28);
          bVar34 = (byte)(uVar47 >> 0x30);
          bVar77 = (byte)(uVar42 >> 0x30);
          bVar37 = (byte)(uVar42 >> 0x38);
          bVar35 = (byte)(uVar47 >> 0x38);
          auVar59[0] = -((byte)((bVar40 < bVar58) * bVar40 | (bVar40 >= bVar58) * bVar58) == bVar58)
          ;
          auVar59[1] = -((byte)((bVar29 < bVar72) * bVar29 | (bVar29 >= bVar72) * bVar72) == bVar72)
          ;
          auVar59[2] = -((byte)((bVar30 < bVar73) * bVar30 | (bVar30 >= bVar73) * bVar73) == bVar73)
          ;
          auVar59[3] = -((byte)((bVar31 < bVar74) * bVar31 | (bVar31 >= bVar74) * bVar74) == bVar74)
          ;
          auVar59[4] = -((byte)((bVar32 < bVar75) * bVar32 | (bVar32 >= bVar75) * bVar75) == bVar75)
          ;
          auVar59[5] = -((byte)((bVar33 < bVar76) * bVar33 | (bVar33 >= bVar76) * bVar76) == bVar76)
          ;
          auVar59[6] = -((byte)((bVar34 < bVar77) * bVar34 | (bVar34 >= bVar77) * bVar77) == bVar77)
          ;
          auVar59[7] = -((byte)((bVar35 < bVar37) * bVar35 | (bVar35 >= bVar37) * bVar37) == bVar37)
          ;
          auVar59[8] = 0xff;
          auVar59[9] = 0xff;
          auVar59[10] = 0xff;
          auVar59[0xb] = 0xff;
          auVar59[0xc] = 0xff;
          auVar59[0xd] = 0xff;
          auVar59[0xe] = 0xff;
          auVar59[0xf] = 0xff;
          auVar182 = pmovzxbd(auVar80,auVar80);
          fVar168 = *(float *)(uVar54 + 0x38 + lVar50);
          fVar152 = *(float *)(uVar54 + 0x3c + lVar50);
          fVar170 = *(float *)(uVar54 + 0x40 + lVar50);
          fVar78 = *(float *)(uVar54 + 0x44 + lVar50);
          fVar154 = (float)auVar182._0_4_ * fVar78 + fVar168;
          fVar160 = (float)auVar182._4_4_ * fVar78 + fVar168;
          fVar163 = (float)auVar182._8_4_ * fVar78 + fVar168;
          fVar167 = (float)auVar182._12_4_ * fVar78 + fVar168;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = *(ulong *)(uVar54 + 0x50 + lVar50);
          auVar182 = pmovzxbd(auVar81,auVar81);
          fVar128 = *(float *)(uVar54 + 0x74 + lVar50);
          fVar119 = *(float *)(uVar54 + 0x68 + lVar50);
          auVar181 = pmovzxbd(auVar106,auVar106);
          fVar155 = (float)auVar181._0_4_ * fVar78 + fVar168;
          fVar184 = (float)auVar181._4_4_ * fVar78 + fVar168;
          fVar164 = (float)auVar181._8_4_ * fVar78 + fVar168;
          fVar168 = (float)auVar181._12_4_ * fVar78 + fVar168;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)(uVar54 + 0x54 + lVar50);
          auVar181 = pmovzxbd(auVar107,auVar107);
          auVar120._8_8_ = 0;
          auVar120._0_8_ = *(ulong *)(uVar54 + 0x28 + lVar50);
          auVar112 = pmovzxbd(auVar120,auVar120);
          fVar78 = *(float *)(uVar54 + 0x48 + lVar50);
          fVar138 = (float)auVar112._0_4_ * fVar78 + fVar152;
          fVar148 = (float)auVar112._4_4_ * fVar78 + fVar152;
          fVar126 = (float)auVar112._8_4_ * fVar78 + fVar152;
          fVar151 = (float)auVar112._12_4_ * fVar78 + fVar152;
          auVar121._8_8_ = 0;
          auVar121._0_8_ = *(ulong *)(uVar54 + 0x58 + lVar50);
          auVar122 = pmovzxbd(auVar121,auVar121);
          fVar150 = *(float *)(uVar54 + 0x78 + lVar50);
          fVar153 = *(float *)(uVar54 + 0x6c + lVar50);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = *(ulong *)(uVar54 + 0x2c + lVar50);
          auVar112 = pmovzxbd(auVar141,auVar141);
          fVar139 = (float)auVar112._0_4_ * fVar78 + fVar152;
          fVar149 = (float)auVar112._4_4_ * fVar78 + fVar152;
          fVar180 = (float)auVar112._8_4_ * fVar78 + fVar152;
          fVar152 = (float)auVar112._12_4_ * fVar78 + fVar152;
          auVar130._8_8_ = 0;
          auVar130._0_8_ = *(ulong *)(uVar54 + 0x5c + lVar50);
          auVar131 = pmovzxbd(auVar130,auVar130);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = *(ulong *)(uVar54 + 0x30 + lVar50);
          auVar112 = pmovzxbd(auVar142,auVar142);
          fVar78 = *(float *)(uVar54 + 0x4c + lVar50);
          fVar156 = (float)auVar112._0_4_ * fVar78 + fVar170;
          fVar161 = (float)auVar112._4_4_ * fVar78 + fVar170;
          fVar165 = (float)auVar112._8_4_ * fVar78 + fVar170;
          fVar169 = (float)auVar112._12_4_ * fVar78 + fVar170;
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)(uVar54 + 0x60 + lVar50);
          auVar144 = pmovzxbd(auVar143,auVar143);
          fVar140 = *(float *)(uVar54 + 0x7c + lVar50);
          fVar124 = *(float *)(uVar54 + 0x70 + lVar50);
          auVar158._8_8_ = 0;
          auVar158._0_8_ = *(ulong *)(uVar54 + 0x34 + lVar50);
          auVar112 = pmovzxbd(auVar158,auVar158);
          fVar157 = (float)auVar112._0_4_ * fVar78 + fVar170;
          fVar162 = (float)auVar112._4_4_ * fVar78 + fVar170;
          fVar166 = (float)auVar112._8_4_ * fVar78 + fVar170;
          fVar170 = (float)auVar112._12_4_ * fVar78 + fVar170;
          auVar113._8_8_ = 0;
          auVar113._0_8_ = *(ulong *)(uVar54 + 100 + lVar50);
          auVar112 = pmovzxbd(auVar113,auVar113);
          fVar78 = (((((float)auVar182._0_4_ * fVar128 + fVar119) - fVar154) * fVar94 + fVar154) -
                   local_938) * local_958;
          fVar154 = (((((float)auVar182._4_4_ * fVar128 + fVar119) - fVar160) * fVar94 + fVar160) -
                    fStack_934) * fStack_954;
          fVar160 = (((((float)auVar182._8_4_ * fVar128 + fVar119) - fVar163) * fVar94 + fVar163) -
                    fStack_930) * fStack_950;
          fVar163 = (((((float)auVar182._12_4_ * fVar128 + fVar119) - fVar167) * fVar94 + fVar167) -
                    fStack_92c) * fStack_94c;
          fVar167 = (((((float)auVar122._0_4_ * fVar150 + fVar153) - fVar138) * fVar94 + fVar138) -
                    local_948) * local_968;
          fVar125 = (((((float)auVar122._4_4_ * fVar150 + fVar153) - fVar148) * fVar94 + fVar148) -
                    fStack_944) * fStack_964;
          fVar127 = (((((float)auVar122._8_4_ * fVar150 + fVar153) - fVar126) * fVar94 + fVar126) -
                    fStack_940) * fStack_960;
          fVar151 = (((((float)auVar122._12_4_ * fVar150 + fVar153) - fVar151) * fVar94 + fVar151) -
                    fStack_93c) * fStack_95c;
          fVar138 = (((((float)auVar181._0_4_ * fVar128 + fVar119) - fVar155) * fVar94 + fVar155) -
                    local_938) * local_908;
          fVar148 = (((((float)auVar181._4_4_ * fVar128 + fVar119) - fVar184) * fVar94 + fVar184) -
                    fStack_934) * fStack_904;
          fVar126 = (((((float)auVar181._8_4_ * fVar128 + fVar119) - fVar164) * fVar94 + fVar164) -
                    fStack_930) * fStack_900;
          fVar168 = (((((float)auVar181._12_4_ * fVar128 + fVar119) - fVar168) * fVar94 + fVar168) -
                    fStack_92c) * fStack_8fc;
          fVar128 = (((((float)auVar131._0_4_ * fVar150 + fVar153) - fVar139) * fVar94 + fVar139) -
                    local_948) * local_918;
          fVar119 = (((((float)auVar131._4_4_ * fVar150 + fVar153) - fVar149) * fVar94 + fVar149) -
                    fStack_944) * fStack_914;
          fVar139 = (((((float)auVar131._8_4_ * fVar150 + fVar153) - fVar180) * fVar94 + fVar180) -
                    fStack_940) * fStack_910;
          fVar152 = (((((float)auVar131._12_4_ * fVar150 + fVar153) - fVar152) * fVar94 + fVar152) -
                    fStack_93c) * fStack_90c;
          uVar95 = (uint)((int)fVar138 < (int)fVar78) * (int)fVar138 |
                   (uint)((int)fVar138 >= (int)fVar78) * (int)fVar78;
          uVar101 = (uint)((int)fVar148 < (int)fVar154) * (int)fVar148 |
                    (uint)((int)fVar148 >= (int)fVar154) * (int)fVar154;
          uVar102 = (uint)((int)fVar126 < (int)fVar160) * (int)fVar126 |
                    (uint)((int)fVar126 >= (int)fVar160) * (int)fVar160;
          uVar103 = (uint)((int)fVar168 < (int)fVar163) * (int)fVar168 |
                    (uint)((int)fVar168 >= (int)fVar163) * (int)fVar163;
          uVar104 = (uint)((int)fVar138 < (int)fVar78) * (int)fVar78 |
                    (uint)((int)fVar138 >= (int)fVar78) * (int)fVar138;
          uVar108 = (uint)((int)fVar148 < (int)fVar154) * (int)fVar154 |
                    (uint)((int)fVar148 >= (int)fVar154) * (int)fVar148;
          uVar109 = (uint)((int)fVar126 < (int)fVar160) * (int)fVar160 |
                    (uint)((int)fVar126 >= (int)fVar160) * (int)fVar126;
          uVar110 = (uint)((int)fVar168 < (int)fVar163) * (int)fVar163 |
                    (uint)((int)fVar168 >= (int)fVar163) * (int)fVar168;
          uVar44 = (uint)((int)fVar128 < (int)fVar167) * (int)fVar128 |
                   (uint)((int)fVar128 >= (int)fVar167) * (int)fVar167;
          uVar91 = (uint)((int)fVar119 < (int)fVar125) * (int)fVar119 |
                   (uint)((int)fVar119 >= (int)fVar125) * (int)fVar125;
          uVar92 = (uint)((int)fVar139 < (int)fVar127) * (int)fVar139 |
                   (uint)((int)fVar139 >= (int)fVar127) * (int)fVar127;
          uVar93 = (uint)((int)fVar152 < (int)fVar151) * (int)fVar152 |
                   (uint)((int)fVar152 >= (int)fVar151) * (int)fVar151;
          uVar44 = ((int)uVar44 < (int)uVar95) * uVar95 | ((int)uVar44 >= (int)uVar95) * uVar44;
          uVar91 = ((int)uVar91 < (int)uVar101) * uVar101 | ((int)uVar91 >= (int)uVar101) * uVar91;
          uVar92 = ((int)uVar92 < (int)uVar102) * uVar102 | ((int)uVar92 >= (int)uVar102) * uVar92;
          uVar93 = ((int)uVar93 < (int)uVar103) * uVar103 | ((int)uVar93 >= (int)uVar103) * uVar93;
          uVar95 = (uint)((int)fVar128 < (int)fVar167) * (int)fVar167 |
                   (uint)((int)fVar128 >= (int)fVar167) * (int)fVar128;
          uVar101 = (uint)((int)fVar119 < (int)fVar125) * (int)fVar125 |
                    (uint)((int)fVar119 >= (int)fVar125) * (int)fVar119;
          uVar102 = (uint)((int)fVar139 < (int)fVar127) * (int)fVar127 |
                    (uint)((int)fVar139 >= (int)fVar127) * (int)fVar139;
          uVar103 = (uint)((int)fVar152 < (int)fVar151) * (int)fVar151 |
                    (uint)((int)fVar152 >= (int)fVar151) * (int)fVar152;
          fVar128 = (((((float)auVar144._0_4_ * fVar140 + fVar124) - fVar156) * fVar94 + fVar156) -
                    local_878) * local_928;
          fVar119 = (((((float)auVar144._4_4_ * fVar140 + fVar124) - fVar161) * fVar94 + fVar161) -
                    fStack_874) * fStack_924;
          fVar150 = (((((float)auVar144._8_4_ * fVar140 + fVar124) - fVar165) * fVar94 + fVar165) -
                    fStack_870) * fStack_920;
          fVar153 = (((((float)auVar144._12_4_ * fVar140 + fVar124) - fVar169) * fVar94 + fVar169) -
                    fStack_86c) * fStack_91c;
          fVar168 = (((((float)auVar112._0_4_ * fVar140 + fVar124) - fVar157) * fVar94 + fVar157) -
                    local_878) * local_898;
          fVar152 = (((((float)auVar112._4_4_ * fVar140 + fVar124) - fVar162) * fVar94 + fVar162) -
                    fStack_874) * fStack_894;
          fVar78 = (((((float)auVar112._8_4_ * fVar140 + fVar124) - fVar166) * fVar94 + fVar166) -
                   fStack_870) * fStack_890;
          fVar170 = (((((float)auVar112._12_4_ * fVar140 + fVar124) - fVar170) * fVar94 + fVar170) -
                    fStack_86c) * fStack_88c;
          uVar129 = ((int)uVar104 < (int)uVar95) * uVar104 | ((int)uVar104 >= (int)uVar95) * uVar95;
          uVar135 = ((int)uVar108 < (int)uVar101) * uVar108 |
                    ((int)uVar108 >= (int)uVar101) * uVar101;
          uVar136 = ((int)uVar109 < (int)uVar102) * uVar109 |
                    ((int)uVar109 >= (int)uVar102) * uVar102;
          uVar137 = ((int)uVar110 < (int)uVar103) * uVar110 |
                    ((int)uVar110 >= (int)uVar103) * uVar103;
          uVar95 = (uint)((int)fVar168 < (int)fVar128) * (int)fVar168 |
                   (uint)((int)fVar168 >= (int)fVar128) * (int)fVar128;
          uVar101 = (uint)((int)fVar152 < (int)fVar119) * (int)fVar152 |
                    (uint)((int)fVar152 >= (int)fVar119) * (int)fVar119;
          uVar102 = (uint)((int)fVar78 < (int)fVar150) * (int)fVar78 |
                    (uint)((int)fVar78 >= (int)fVar150) * (int)fVar150;
          uVar103 = (uint)((int)fVar170 < (int)fVar153) * (int)fVar170 |
                    (uint)((int)fVar170 >= (int)fVar153) * (int)fVar153;
          uVar104 = (uint)((int)fVar168 < (int)fVar128) * (int)fVar128 |
                    (uint)((int)fVar168 >= (int)fVar128) * (int)fVar168;
          uVar108 = (uint)((int)fVar152 < (int)fVar119) * (int)fVar119 |
                    (uint)((int)fVar152 >= (int)fVar119) * (int)fVar152;
          uVar109 = (uint)((int)fVar78 < (int)fVar150) * (int)fVar150 |
                    (uint)((int)fVar78 >= (int)fVar150) * (int)fVar78;
          uVar110 = (uint)((int)fVar170 < (int)fVar153) * (int)fVar153 |
                    (uint)((int)fVar170 >= (int)fVar153) * (int)fVar170;
          uVar95 = (uint)((int)uVar95 < (int)local_888) * (int)local_888 |
                   ((int)uVar95 >= (int)local_888) * uVar95;
          uVar101 = (uint)((int)uVar101 < (int)fStack_884) * (int)fStack_884 |
                    ((int)uVar101 >= (int)fStack_884) * uVar101;
          uVar102 = (uint)((int)uVar102 < (int)fStack_880) * (int)fStack_880 |
                    ((int)uVar102 >= (int)fStack_880) * uVar102;
          uVar103 = (uint)((int)uVar103 < (int)fStack_87c) * (int)fStack_87c |
                    ((int)uVar103 >= (int)fStack_87c) * uVar103;
          iVar41 = local_868._0_4_;
          uVar104 = (uint)(iVar41 < (int)uVar104) * iVar41 | (iVar41 >= (int)uVar104) * uVar104;
          iVar41 = local_868._4_4_;
          uVar108 = (uint)(iVar41 < (int)uVar108) * iVar41 | (iVar41 >= (int)uVar108) * uVar108;
          iVar41 = local_868._8_4_;
          uVar109 = (uint)(iVar41 < (int)uVar109) * iVar41 | (iVar41 >= (int)uVar109) * uVar109;
          iVar41 = local_868._12_4_;
          uVar110 = (uint)(iVar41 < (int)uVar110) * iVar41 | (iVar41 >= (int)uVar110) * uVar110;
          auVar96._0_4_ =
               -(uint)((int)(((int)uVar129 < (int)uVar104) * uVar129 |
                            ((int)uVar129 >= (int)uVar104) * uVar104) <
                      (int)(((int)uVar95 < (int)uVar44) * uVar44 |
                           ((int)uVar95 >= (int)uVar44) * uVar95));
          auVar96._4_4_ =
               -(uint)((int)(((int)uVar135 < (int)uVar108) * uVar135 |
                            ((int)uVar135 >= (int)uVar108) * uVar108) <
                      (int)(((int)uVar101 < (int)uVar91) * uVar91 |
                           ((int)uVar101 >= (int)uVar91) * uVar101));
          auVar96._8_4_ =
               -(uint)((int)(((int)uVar136 < (int)uVar109) * uVar136 |
                            ((int)uVar136 >= (int)uVar109) * uVar109) <
                      (int)(((int)uVar102 < (int)uVar92) * uVar92 |
                           ((int)uVar102 >= (int)uVar92) * uVar102));
          auVar96._12_4_ =
               -(uint)((int)(((int)uVar137 < (int)uVar110) * uVar137 |
                            ((int)uVar137 >= (int)uVar110) * uVar110) <
                      (int)(((int)uVar103 < (int)uVar93) * uVar93 |
                           ((int)uVar103 >= (int)uVar93) * uVar103));
          auVar182 = pmovsxbd(auVar59,auVar59);
          uVar44 = movmskps((int)local_ae0,~auVar96 & auVar182);
          if (uVar44 != 0) {
            local_ae8 = (ulong)(uVar44 & 0xff);
            local_c78 = lVar50 + uVar54;
            do {
              lVar50 = 0;
              if (local_ae8 != 0) {
                for (; (local_ae8 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              uVar20 = *(ushort *)(local_c78 + lVar50 * 8);
              uVar21 = *(ushort *)(local_c78 + 2 + lVar50 * 8);
              local_c40 = (ulong)*(uint *)(local_c78 + 0x88);
              local_ba8 = (ulong)*(uint *)(local_c78 + 4 + lVar50 * 8);
              local_b90 = *(long *)&(local_c10->org).field_0;
              lVar50 = *(long *)(*(long *)(local_b90 + 0x1e8) + local_c40 * 8);
              local_b98 = *(long *)(lVar50 + 0x58);
              local_ba0 = local_ba8 * *(long *)(lVar50 + 0x68);
              fVar168 = *(float *)(lVar50 + 0x2c);
              local_818 = ((*(float *)((long)&(local_c60->collider).name + 4) - fVar168) /
                          (*(float *)(lVar50 + 0x30) - fVar168)) * *(float *)(lVar50 + 0x28);
              auVar82 = roundss(ZEXT416((uint)fVar168),ZEXT416((uint)local_818),9);
              fVar168 = *(float *)(lVar50 + 0x28) + -1.0;
              if (fVar168 <= auVar82._0_4_) {
                auVar82._0_4_ = fVar168;
              }
              fVar168 = 0.0;
              if (0.0 <= auVar82._0_4_) {
                fVar168 = auVar82._0_4_;
              }
              uVar91 = uVar20 & 0x7fff;
              uVar44 = *(uint *)(local_b98 + 4 + local_ba0);
              uVar47 = (ulong)uVar44;
              uVar42 = (ulong)(uVar44 * (uVar21 & 0x7fff) + *(int *)(local_b98 + local_ba0) + uVar91
                              );
              lVar50 = *(long *)(lVar50 + 0xe0);
              lVar48 = (long)(int)fVar168 * 0x38;
              lVar22 = *(long *)(lVar50 + 0x10 + lVar48);
              lVar23 = *(long *)(lVar50 + lVar48);
              pfVar16 = (float *)(lVar23 + lVar22 * uVar42);
              lVar24 = *(long *)(lVar50 + 0x38 + lVar48);
              lVar48 = *(long *)(lVar50 + 0x48 + lVar48);
              pfVar17 = (float *)(lVar24 + lVar48 * uVar42);
              pfVar1 = (float *)(lVar23 + (uVar42 + 1) * lVar22);
              pfVar2 = (float *)(lVar24 + lVar48 * (uVar42 + 1));
              lVar50 = uVar42 + uVar47;
              pfVar3 = (float *)(lVar23 + lVar50 * lVar22);
              pfVar4 = (float *)(lVar24 + lVar48 * lVar50);
              lVar43 = uVar42 + uVar47 + 1;
              pfVar5 = (float *)(lVar23 + lVar43 * lVar22);
              pfVar6 = (float *)(lVar24 + lVar48 * lVar43);
              uVar51 = (ulong)(-1 < (short)uVar20);
              lVar45 = uVar42 + uVar51 + 1;
              pfVar7 = (float *)(lVar23 + lVar45 * lVar22);
              pfVar8 = (float *)(lVar24 + lVar48 * lVar45);
              lVar45 = uVar51 + lVar43;
              pfVar9 = (float *)(lVar23 + lVar45 * lVar22);
              uVar42 = 0;
              if (-1 < (short)uVar21) {
                uVar42 = uVar47;
              }
              pfVar10 = (float *)(lVar24 + lVar48 * lVar45);
              pfVar11 = (float *)(lVar23 + (lVar50 + uVar42) * lVar22);
              local_818 = local_818 - fVar168;
              pfVar12 = (float *)(lVar24 + lVar48 * (lVar50 + uVar42));
              lVar50 = (lVar43 + uVar42) * lVar22;
              pfVar13 = (float *)(lVar23 + lVar50);
              pfVar14 = (float *)(lVar24 + lVar48 * (lVar43 + uVar42));
              local_a18 = (*pfVar2 - *pfVar1) * local_818 + *pfVar1;
              local_8c8 = (pfVar2[1] - pfVar1[1]) * local_818 + pfVar1[1];
              local_a08 = (pfVar2[2] - pfVar1[2]) * local_818 + pfVar1[2];
              local_8e8 = (*pfVar4 - *pfVar3) * local_818 + *pfVar3;
              local_8d8 = (pfVar4[1] - pfVar3[1]) * local_818 + pfVar3[1];
              local_c28._0_4_ = (pfVar4[2] - pfVar3[2]) * local_818 + pfVar3[2];
              local_c38 = (*pfVar6 - *pfVar5) * local_818 + *pfVar5;
              fStack_c34 = (pfVar6[1] - pfVar5[1]) * local_818 + pfVar5[1];
              fStack_c30 = (pfVar6[2] - pfVar5[2]) * local_818 + pfVar5[2];
              fStack_a14 = (*pfVar8 - *pfVar7) * local_818 + *pfVar7;
              fStack_8c4 = (pfVar8[1] - pfVar7[1]) * local_818 + pfVar7[1];
              fStack_a04 = (pfVar8[2] - pfVar7[2]) * local_818 + pfVar7[2];
              local_828 = (*pfVar10 - *pfVar9) * local_818 + *pfVar9;
              fStack_824 = (pfVar10[1] - pfVar9[1]) * local_818 + pfVar9[1];
              fStack_820 = (pfVar10[2] - pfVar9[2]) * local_818 + pfVar9[2];
              fStack_8dc = (*pfVar12 - *pfVar11) * local_818 + *pfVar11;
              fStack_8cc = (pfVar12[1] - pfVar11[1]) * local_818 + pfVar11[1];
              fStack_814 = local_818;
              fStack_810 = local_818;
              fStack_80c = local_818;
              local_838 = (*pfVar14 - *pfVar13) * local_818 + *pfVar13;
              fStack_834 = (pfVar14[1] - pfVar13[1]) * local_818 + pfVar13[1];
              fStack_830 = (pfVar14[2] - pfVar13[2]) * local_818 + pfVar13[2];
              fStack_81c = (pfVar10[3] - pfVar9[3]) * local_818 + pfVar9[3];
              local_b88 = CONCAT44(fStack_a14,local_a18);
              fStack_82c = (pfVar14[3] - pfVar13[3]) * local_818 + pfVar13[3];
              fStack_c2c = (pfVar6[3] - pfVar5[3]) * local_818 + pfVar5[3];
              local_9b8 = *(float *)&local_c60->ptr;
              local_9a8 = *(float *)((long)&local_c60->ptr + 4);
              local_998 = *(float *)&local_c60->leafIntersector;
              local_b28 = ((pfVar17[1] - pfVar16[1]) * local_818 + pfVar16[1]) - local_9a8;
              fStack_b24 = local_8c8 - local_9a8;
              fStack_b20 = fStack_c34 - local_9a8;
              fStack_b1c = local_8d8 - local_9a8;
              local_b08 = ((pfVar17[2] - pfVar16[2]) * local_818 + pfVar16[2]) - local_998;
              fStack_b04 = local_a08 - local_998;
              fStack_b00 = fStack_c30 - local_998;
              fStack_afc = (float)local_c28._0_4_ - local_998;
              fStack_8d4 = fStack_c34;
              fStack_8d0 = fStack_834;
              local_c58._0_4_ = local_8d8 - local_9a8;
              local_c58._4_4_ = fStack_c34 - local_9a8;
              fStack_c50 = fStack_834 - local_9a8;
              fStack_c4c = fStack_8cc - local_9a8;
              local_8b8 = CONCAT44(fStack_c30,local_c28._0_4_);
              local_c28._0_4_ = (float)local_c28._0_4_ - local_998;
              local_c28._4_4_ = fStack_c30 - local_998;
              fStack_c20 = fStack_830 - local_998;
              fStack_c1c = ((pfVar12[2] - pfVar11[2]) * local_818 + pfVar11[2]) - local_998;
              local_b58._0_4_ = (float)local_c58._0_4_ - local_b28;
              local_b58._4_4_ = (float)local_c58._4_4_ - fStack_b24;
              fStack_b50 = fStack_c50 - fStack_b20;
              fStack_b4c = fStack_c4c - fStack_b1c;
              local_b48._0_4_ = (float)local_c28._0_4_ - local_b08;
              local_b48._4_4_ = (float)local_c28._4_4_ - fStack_b04;
              fStack_b40 = fStack_c20 - fStack_b00;
              fStack_b3c = fStack_c1c - fStack_afc;
              local_b18 = ((*pfVar17 - *pfVar16) * local_818 + *pfVar16) - local_9b8;
              fStack_b14 = local_a18 - local_9b8;
              fStack_b10 = local_c38 - local_9b8;
              fStack_b0c = local_8e8 - local_9b8;
              fStack_8e4 = local_c38;
              fStack_8e0 = local_838;
              local_9c8 = local_8e8 - local_9b8;
              fStack_9c4 = local_c38 - local_9b8;
              fStack_9c0 = local_838 - local_9b8;
              fStack_9bc = fStack_8dc - local_9b8;
              local_b68 = local_9c8 - local_b18;
              fStack_b64 = fStack_9c4 - fStack_b14;
              fStack_b60 = fStack_9c0 - fStack_b10;
              fStack_b5c = fStack_9bc - fStack_b0c;
              local_cb8._0_4_ = *(float *)&(local_c60->collider).collide;
              local_c88._0_4_ = *(float *)((long)&(local_c60->collider).collide + 4);
              fStack_c90 = *(float *)&(local_c60->collider).name;
              local_c88._4_4_ = (float)local_c88;
              fStack_c80 = (float)local_c88;
              fStack_c7c = (float)local_c88;
              local_cb8._4_4_ = (float)local_cb8;
              fStack_cb0 = (float)local_cb8;
              fStack_cac = (float)local_cb8;
              fVar151 = ((float)local_b58._0_4_ * ((float)local_c28._0_4_ + local_b08) -
                        (float)local_b48._0_4_ * ((float)local_c58._0_4_ + local_b28)) *
                        (float)local_cb8 +
                        ((float)local_b48._0_4_ * (local_9c8 + local_b18) -
                        ((float)local_c28._0_4_ + local_b08) * local_b68) * (float)local_c88 +
                        (((float)local_c58._0_4_ + local_b28) * local_b68 -
                        (local_9c8 + local_b18) * (float)local_b58._0_4_) * fStack_c90;
              fVar139 = ((float)local_b58._4_4_ * ((float)local_c28._4_4_ + fStack_b04) -
                        (float)local_b48._4_4_ * ((float)local_c58._4_4_ + fStack_b24)) *
                        (float)local_cb8 +
                        ((float)local_b48._4_4_ * (fStack_9c4 + fStack_b14) -
                        ((float)local_c28._4_4_ + fStack_b04) * fStack_b64) * (float)local_c88 +
                        (((float)local_c58._4_4_ + fStack_b24) * fStack_b64 -
                        (fStack_9c4 + fStack_b14) * (float)local_b58._4_4_) * fStack_c90;
              fStack_ca0 = (fStack_b50 * (fStack_c20 + fStack_b00) -
                           fStack_b40 * (fStack_c50 + fStack_b20)) * (float)local_cb8 +
                           (fStack_b40 * (fStack_9c0 + fStack_b10) -
                           (fStack_c20 + fStack_b00) * fStack_b60) * (float)local_c88 +
                           ((fStack_c50 + fStack_b20) * fStack_b60 -
                           (fStack_9c0 + fStack_b10) * fStack_b50) * fStack_c90;
              fStack_c9c = (fStack_b4c * (fStack_c1c + fStack_afc) -
                           fStack_b3c * (fStack_c4c + fStack_b1c)) * (float)local_cb8 +
                           (fStack_b3c * (fStack_9bc + fStack_b0c) -
                           (fStack_c1c + fStack_afc) * fStack_b5c) * (float)local_c88 +
                           ((fStack_c4c + fStack_b1c) * fStack_b5c -
                           (fStack_9bc + fStack_b0c) * fStack_b4c) * fStack_c90;
              fStack_8c0 = fStack_824;
              fStack_8bc = fStack_c34;
              fStack_9a4 = local_9a8;
              fStack_9a0 = local_9a8;
              fStack_99c = local_9a8;
              local_9f8 = local_8c8 - local_9a8;
              fStack_9f4 = fStack_8c4 - local_9a8;
              fStack_9f0 = fStack_824 - local_9a8;
              fStack_9ec = fStack_c34 - local_9a8;
              local_8a8 = CONCAT44(fStack_a04,local_a08);
              local_898 = fStack_820;
              fStack_894 = fStack_c30;
              fStack_994 = local_998;
              fStack_990 = local_998;
              fStack_98c = local_998;
              local_a08 = local_a08 - local_998;
              fStack_a04 = fStack_a04 - local_998;
              fStack_a00 = fStack_820 - local_998;
              fStack_9fc = fStack_c30 - local_998;
              local_b38._0_4_ = local_b28 - local_9f8;
              local_b38._4_4_ = fStack_b24 - fStack_9f4;
              fStack_b30 = fStack_b20 - fStack_9f0;
              fStack_b2c = fStack_b1c - fStack_9ec;
              fVar163 = local_b08 - local_a08;
              fVar94 = fStack_b04 - fStack_a04;
              fVar138 = fStack_b00 - fStack_a00;
              fVar148 = fStack_afc - fStack_9fc;
              fStack_9b4 = local_9b8;
              fStack_9b0 = local_9b8;
              fStack_9ac = local_9b8;
              local_a18 = local_a18 - local_9b8;
              fStack_a14 = fStack_a14 - local_9b8;
              fStack_a10 = fStack_b80 - local_9b8;
              fStack_a0c = fStack_b7c - local_9b8;
              fVar140 = local_b18 - local_a18;
              fVar124 = fStack_b14 - fStack_a14;
              fVar154 = fStack_b10 - fStack_a10;
              fVar160 = fStack_b0c - fStack_a0c;
              local_7f8._0_4_ =
                   ((float)local_b38._0_4_ * (local_b08 + local_a08) -
                   fVar163 * (local_b28 + local_9f8)) * (float)local_cb8 +
                   (fVar163 * (local_b18 + local_a18) - (local_b08 + local_a08) * fVar140) *
                   (float)local_c88 +
                   ((local_b28 + local_9f8) * fVar140 -
                   (local_b18 + local_a18) * (float)local_b38._0_4_) * fStack_c90;
              local_7f8._4_4_ =
                   ((float)local_b38._4_4_ * (fStack_b04 + fStack_a04) -
                   fVar94 * (fStack_b24 + fStack_9f4)) * (float)local_cb8 +
                   (fVar94 * (fStack_b14 + fStack_a14) - (fStack_b04 + fStack_a04) * fVar124) *
                   (float)local_c88 +
                   ((fStack_b24 + fStack_9f4) * fVar124 -
                   (fStack_b14 + fStack_a14) * (float)local_b38._4_4_) * fStack_c90;
              local_7f8._8_4_ =
                   (fStack_b30 * (fStack_b00 + fStack_a00) - fVar138 * (fStack_b20 + fStack_9f0)) *
                   (float)local_cb8 +
                   (fVar138 * (fStack_b10 + fStack_a10) - (fStack_b00 + fStack_a00) * fVar154) *
                   (float)local_c88 +
                   ((fStack_b20 + fStack_9f0) * fVar154 - (fStack_b10 + fStack_a10) * fStack_b30) *
                   fStack_c90;
              local_7f8._12_4_ =
                   (fStack_b2c * (fStack_afc + fStack_9fc) - fVar148 * (fStack_b1c + fStack_9ec)) *
                   (float)local_cb8 +
                   (fVar148 * (fStack_b0c + fStack_a0c) - (fStack_afc + fStack_9fc) * fVar160) *
                   (float)local_c88 +
                   ((fStack_b1c + fStack_9ec) * fVar160 - (fStack_b0c + fStack_a0c) * fStack_b2c) *
                   fStack_c90;
              fVar126 = local_9f8 - (float)local_c58._0_4_;
              fVar167 = fStack_9f4 - (float)local_c58._4_4_;
              fVar125 = fStack_9f0 - fStack_c50;
              fVar127 = fStack_9ec - fStack_c4c;
              local_7e8 = local_a08 - (float)local_c28._0_4_;
              fStack_7e4 = fStack_a04 - (float)local_c28._4_4_;
              fStack_7e0 = fStack_a00 - fStack_c20;
              fStack_7dc = fStack_9fc - fStack_c1c;
              local_9d8 = local_9f8 + (float)local_c58._0_4_;
              fStack_9d4 = fStack_9f4 + (float)local_c58._4_4_;
              fStack_9d0 = fStack_9f0 + fStack_c50;
              fStack_9cc = fStack_9ec + fStack_c4c;
              local_9e8 = local_a08 + (float)local_c28._0_4_;
              fStack_9e4 = fStack_a04 + (float)local_c28._4_4_;
              fStack_9e0 = fStack_a00 + fStack_c20;
              fStack_9dc = fStack_9fc + fStack_c1c;
              fVar128 = local_a18 - local_9c8;
              fVar119 = fStack_a14 - fStack_9c4;
              fVar150 = fStack_a10 - fStack_9c0;
              fVar153 = fStack_a0c - fStack_9bc;
              local_a28 = local_a18 + local_9c8;
              fStack_a24 = fStack_a14 + fStack_9c4;
              fStack_a20 = fStack_a10 + fStack_9c0;
              fStack_a1c = fStack_a0c + fStack_9bc;
              auVar60._0_4_ =
                   (fVar126 * local_9e8 - local_7e8 * local_9d8) * (float)local_cb8 +
                   (local_7e8 * local_a28 - fVar128 * local_9e8) * (float)local_c88 +
                   (fVar128 * local_9d8 - fVar126 * local_a28) * fStack_c90;
              auVar60._4_4_ =
                   (fVar167 * fStack_9e4 - fStack_7e4 * fStack_9d4) * (float)local_cb8 +
                   (fStack_7e4 * fStack_a24 - fVar119 * fStack_9e4) * (float)local_c88 +
                   (fVar119 * fStack_9d4 - fVar167 * fStack_a24) * fStack_c90;
              auVar60._8_4_ =
                   (fVar125 * fStack_9e0 - fStack_7e0 * fStack_9d0) * (float)local_cb8 +
                   (fStack_7e0 * fStack_a20 - fVar150 * fStack_9e0) * (float)local_c88 +
                   (fVar150 * fStack_9d0 - fVar125 * fStack_a20) * fStack_c90;
              auVar60._12_4_ =
                   (fVar127 * fStack_9dc - fStack_7dc * fStack_9cc) * (float)local_cb8 +
                   (fStack_7dc * fStack_a1c - fVar153 * fStack_9dc) * (float)local_c88 +
                   (fVar153 * fStack_9cc - fVar127 * fStack_a1c) * fStack_c90;
              auVar38._4_4_ = fVar139;
              auVar38._0_4_ = fVar151;
              auVar38._8_4_ = fStack_ca0;
              auVar38._12_4_ = fStack_c9c;
              local_808 = fVar151 + local_7f8._0_4_ + auVar60._0_4_;
              fStack_804 = fVar139 + local_7f8._4_4_ + auVar60._4_4_;
              fStack_800 = fStack_ca0 + local_7f8._8_4_ + auVar60._8_4_;
              fStack_7fc = fStack_c9c + local_7f8._12_4_ + auVar60._12_4_;
              auVar182 = minps(auVar38,local_7f8);
              auVar182 = minps(auVar182,auVar60);
              auVar181 = maxps(auVar38,local_7f8);
              auVar181 = maxps(auVar181,auVar60);
              fVar168 = ABS(local_808);
              fVar152 = ABS(fStack_804);
              fVar170 = ABS(fStack_800);
              fVar78 = ABS(fStack_7fc);
              auVar171._0_4_ =
                   -(uint)(auVar181._0_4_ <= fVar168 * 1.1920929e-07 ||
                          -(fVar168 * 1.1920929e-07) <= auVar182._0_4_) & local_988._0_4_;
              auVar171._4_4_ =
                   -(uint)(auVar181._4_4_ <= fVar152 * 1.1920929e-07 ||
                          -(fVar152 * 1.1920929e-07) <= auVar182._4_4_) & local_988._4_4_;
              auVar171._8_4_ =
                   -(uint)(auVar181._8_4_ <= fVar170 * 1.1920929e-07 ||
                          -(fVar170 * 1.1920929e-07) <= auVar182._8_4_) & local_988._8_4_;
              auVar171._12_4_ =
                   -(uint)(auVar181._12_4_ <= fVar78 * 1.1920929e-07 ||
                          -(fVar78 * 1.1920929e-07) <= auVar182._12_4_) & local_988._12_4_;
              iVar41 = movmskps((int)lVar50,auVar171);
              puVar15 = (undefined8 *)(lVar23 + lVar22 * (uVar42 + lVar45));
              local_848 = *puVar15;
              uStack_840 = puVar15[1];
              puVar15 = (undefined8 *)(lVar24 + (uVar42 + lVar45) * lVar48);
              local_858 = *puVar15;
              uStack_850 = puVar15[1];
              local_978 = ZEXT416(uVar91);
              local_b78 = ZEXT416((uint)local_828);
              if (iVar41 == 0) {
                iVar41 = 0;
LAB_0022e316:
                auVar174._4_4_ = fStack_c34;
                auVar174._0_4_ = local_c38;
                auVar174._8_4_ = fStack_c30;
              }
              else {
                local_8f8 = fVar168;
                fStack_8f4 = fVar152;
                fStack_8f0 = fVar170;
                fStack_8ec = fVar78;
                fStack_c8c = fStack_c90;
                auVar83._0_4_ =
                     (float)local_b58._0_4_ * fVar163 -
                     (float)local_b48._0_4_ * (float)local_b38._0_4_;
                auVar83._4_4_ =
                     (float)local_b58._4_4_ * fVar94 -
                     (float)local_b48._4_4_ * (float)local_b38._4_4_;
                auVar83._8_4_ = fStack_b50 * fVar138 - fStack_b40 * fStack_b30;
                auVar83._12_4_ = fStack_b4c * fVar148 - fStack_b3c * fStack_b2c;
                auVar39._4_4_ = fStack_7e4;
                auVar39._0_4_ = local_7e8;
                auVar39._8_4_ = fStack_7e0;
                auVar39._12_4_ = fStack_7dc;
                auVar172._0_4_ = (float)local_b38._0_4_ * local_7e8 - fVar163 * fVar126;
                auVar172._4_4_ = (float)local_b38._4_4_ * fStack_7e4 - fVar94 * fVar167;
                auVar172._8_4_ = fStack_b30 * fStack_7e0 - fVar138 * fVar125;
                auVar172._12_4_ = fStack_b2c * fStack_7dc - fVar148 * fVar127;
                auVar61._4_4_ =
                     -(uint)(ABS((float)local_b48._4_4_ * (float)local_b38._4_4_) <
                            ABS(fVar94 * fVar167));
                auVar61._0_4_ =
                     -(uint)(ABS((float)local_b48._0_4_ * (float)local_b38._0_4_) <
                            ABS(fVar163 * fVar126));
                auVar61._8_4_ = -(uint)(ABS(fStack_b40 * fStack_b30) < ABS(fVar138 * fVar125));
                auVar61._12_4_ = -(uint)(ABS(fStack_b3c * fStack_b2c) < ABS(fVar148 * fVar127));
                local_a58 = blendvps(auVar172,auVar83,auVar61);
                auVar175._0_4_ = fVar163 * fVar128 - fVar140 * local_7e8;
                auVar175._4_4_ = fVar94 * fVar119 - fVar124 * fStack_7e4;
                auVar175._8_4_ = fVar138 * fVar150 - fVar154 * fStack_7e0;
                auVar175._12_4_ = fVar148 * fVar153 - fVar160 * fStack_7dc;
                auVar62._4_4_ = -(uint)(ABS(fStack_b64 * fVar94) < ABS(fVar124 * fStack_7e4));
                auVar62._0_4_ = -(uint)(ABS(local_b68 * fVar163) < ABS(fVar140 * local_7e8));
                auVar62._8_4_ = -(uint)(ABS(fStack_b60 * fVar138) < ABS(fVar154 * fStack_7e0));
                auVar62._12_4_ = -(uint)(ABS(fStack_b5c * fVar148) < ABS(fVar160 * fStack_7dc));
                auVar36._4_4_ = (float)local_b48._4_4_ * fVar124 - fStack_b64 * fVar94;
                auVar36._0_4_ = (float)local_b48._0_4_ * fVar140 - local_b68 * fVar163;
                auVar36._8_4_ = fStack_b40 * fVar154 - fStack_b60 * fVar138;
                auVar36._12_4_ = fStack_b3c * fVar160 - fStack_b5c * fVar148;
                local_a48 = blendvps(auVar175,auVar36,auVar62);
                auVar132._0_4_ =
                     local_b68 * (float)local_b38._0_4_ - (float)local_b58._0_4_ * fVar140;
                auVar132._4_4_ =
                     fStack_b64 * (float)local_b38._4_4_ - (float)local_b58._4_4_ * fVar124;
                auVar132._8_4_ = fStack_b60 * fStack_b30 - fStack_b50 * fVar154;
                auVar132._12_4_ = fStack_b5c * fStack_b2c - fStack_b4c * fVar160;
                auVar145._0_4_ = fVar140 * fVar126 - (float)local_b38._0_4_ * fVar128;
                auVar145._4_4_ = fVar124 * fVar167 - (float)local_b38._4_4_ * fVar119;
                auVar145._8_4_ = fVar154 * fVar125 - fStack_b30 * fVar150;
                auVar145._12_4_ = fVar160 * fVar127 - fStack_b2c * fVar153;
                auVar63._4_4_ =
                     -(uint)(ABS((float)local_b58._4_4_ * fVar124) <
                            ABS((float)local_b38._4_4_ * fVar119));
                auVar63._0_4_ =
                     -(uint)(ABS((float)local_b58._0_4_ * fVar140) <
                            ABS((float)local_b38._0_4_ * fVar128));
                auVar63._8_4_ = -(uint)(ABS(fStack_b50 * fVar154) < ABS(fStack_b30 * fVar150));
                auVar63._12_4_ = -(uint)(ABS(fStack_b4c * fVar160) < ABS(fStack_b2c * fVar153));
                local_a38 = blendvps(auVar145,auVar132,auVar63);
                fVar128 = (float)local_cb8 * local_a58._0_4_ +
                          (float)local_c88 * local_a48._0_4_ + fStack_c90 * local_a38._0_4_;
                fVar119 = (float)local_cb8 * local_a58._4_4_ +
                          (float)local_c88 * local_a48._4_4_ + fStack_c90 * local_a38._4_4_;
                fVar150 = (float)local_cb8 * local_a58._8_4_ +
                          (float)local_c88 * local_a48._8_4_ + fStack_c90 * local_a38._8_4_;
                fVar153 = (float)local_cb8 * local_a58._12_4_ +
                          (float)local_c88 * local_a48._12_4_ + fStack_c90 * local_a38._12_4_;
                auVar64._0_4_ = fVar128 + fVar128;
                auVar64._4_4_ = fVar119 + fVar119;
                auVar64._8_4_ = fVar150 + fVar150;
                auVar64._12_4_ = fVar153 + fVar153;
                auVar97._0_4_ = local_b28 * local_a48._0_4_ + local_b08 * local_a38._0_4_;
                auVar97._4_4_ = fStack_b24 * local_a48._4_4_ + fStack_b04 * local_a38._4_4_;
                auVar97._8_4_ = fStack_b20 * local_a48._8_4_ + fStack_b00 * local_a38._8_4_;
                auVar97._12_4_ = fStack_b1c * local_a48._12_4_ + fStack_afc * local_a38._12_4_;
                fVar140 = local_b18 * local_a58._0_4_ + auVar97._0_4_;
                fVar124 = fStack_b14 * local_a58._4_4_ + auVar97._4_4_;
                fVar154 = fStack_b10 * local_a58._8_4_ + auVar97._8_4_;
                fVar160 = fStack_b0c * local_a58._12_4_ + auVar97._12_4_;
                auVar182 = rcpps(auVar97,auVar64);
                fVar128 = auVar182._0_4_;
                fVar119 = auVar182._4_4_;
                fVar150 = auVar182._8_4_;
                fVar153 = auVar182._12_4_;
                local_a68._0_4_ =
                     ((1.0 - auVar64._0_4_ * fVar128) * fVar128 + fVar128) * (fVar140 + fVar140);
                local_a68._4_4_ =
                     ((1.0 - auVar64._4_4_ * fVar119) * fVar119 + fVar119) * (fVar124 + fVar124);
                local_a68._8_4_ =
                     ((1.0 - auVar64._8_4_ * fVar150) * fVar150 + fVar150) * (fVar154 + fVar154);
                local_a68._12_4_ =
                     ((1.0 - auVar64._12_4_ * fVar153) * fVar153 + fVar153) * (fVar160 + fVar160);
                auVar19._0_8_ = (local_c60->intersector1).intersect;
                auVar19._8_8_ = (local_c60->intersector1).occluded;
                fVar119 = (float)auVar19._0_8_;
                fVar128 = *(float *)((long)&local_c60->leafIntersector + 4);
                auVar65._0_4_ =
                     (int)((uint)(auVar64._0_4_ != 0.0 &&
                                 (local_a68._0_4_ <= fVar119 && fVar128 <= local_a68._0_4_)) *
                          -0x80000000) >> 0x1f;
                auVar65._4_4_ =
                     (int)((uint)(auVar64._4_4_ != 0.0 &&
                                 (local_a68._4_4_ <= fVar119 && fVar128 <= local_a68._4_4_)) *
                          -0x80000000) >> 0x1f;
                auVar65._8_4_ =
                     (int)((uint)(auVar64._8_4_ != 0.0 &&
                                 (local_a68._8_4_ <= fVar119 && fVar128 <= local_a68._8_4_)) *
                          -0x80000000) >> 0x1f;
                auVar65._12_4_ =
                     (int)((uint)(auVar64._12_4_ != 0.0 &&
                                 (local_a68._12_4_ <= fVar119 && fVar128 <= local_a68._12_4_)) *
                          -0x80000000) >> 0x1f;
                iVar41 = movmskps(iVar41,auVar65 & auVar171);
                if (iVar41 == 0) goto LAB_0022e316;
                uVar46 = extractps(auVar19,1);
                local_ab8._4_4_ = fStack_804;
                local_ab8._0_4_ = local_808;
                local_ab8._8_4_ = fStack_800;
                local_ab8._12_4_ = fStack_7fc;
                local_aa8 = &local_cbd;
                local_a98 = auVar65 & auVar171;
                auVar84._4_12_ = local_a68._4_12_;
                auVar84._0_4_ = (float)(int)(*(ushort *)(local_b98 + 8 + local_ba0) - 1);
                auVar114._4_4_ = local_a68._4_4_;
                auVar114._0_4_ = auVar84._0_4_;
                auVar114._8_4_ = local_a68._8_4_;
                auVar114._12_4_ = local_a68._12_4_;
                auVar182 = rcpss(auVar114,auVar84);
                auVar123._4_12_ = auVar39._4_12_;
                auVar123._0_4_ = (float)(int)(*(ushort *)(local_b98 + 10 + local_ba0) - 1);
                fStack_acc = (2.0 - auVar84._0_4_ * auVar182._0_4_) * auVar182._0_4_;
                auVar115._4_4_ = fStack_7e4;
                auVar115._0_4_ = auVar123._0_4_;
                auVar115._8_4_ = fStack_7e0;
                auVar115._12_4_ = fStack_7dc;
                auVar182 = rcpss(auVar115,auVar123);
                fVar128 = (2.0 - auVar123._0_4_ * auVar182._0_4_) * auVar182._0_4_;
                local_ad8._0_4_ = fStack_acc * (fVar151 + (float)uVar91 * local_808);
                local_ad8._4_4_ = fStack_acc * (fVar139 + (float)(uVar91 + 1) * fStack_804);
                fStack_ad0 = fStack_acc * (fStack_ca0 + (float)(uVar91 + 1) * fStack_800);
                fStack_acc = fStack_acc * (fStack_c9c + (float)uVar91 * fStack_7fc);
                auVar98._0_4_ = (float)(int)local_828 * local_808 + local_7f8._0_4_;
                auVar98._4_4_ = (float)(int)local_828 * fStack_804 + local_7f8._4_4_;
                auVar98._8_4_ = (float)((int)local_828 + 1) * fStack_800 + local_7f8._8_4_;
                auVar98._12_4_ = (float)((int)local_828 + 1) * fStack_7fc + local_7f8._12_4_;
                local_ac8._4_4_ = fVar128 * auVar98._4_4_;
                local_ac8._0_4_ = fVar128 * auVar98._0_4_;
                fStack_ac0 = fVar128 * auVar98._8_4_;
                fStack_abc = fVar128 * auVar98._12_4_;
                lVar50 = *(long *)(*(long *)(local_b90 + 0x1e8) + local_c40 * 8);
                auVar174._4_4_ = fStack_c34;
                auVar174._0_4_ = local_c38;
                auVar174._8_4_ = fStack_c30;
                if ((*(uint *)(lVar50 + 0x34) & (uint)uVar46) != 0) {
                  local_c98 = *(byte **)&(local_c10->dir).field_0;
                  if ((*(long *)(local_c98 + 0x10) == 0) && (*(long *)(lVar50 + 0x48) == 0))
                  goto LAB_0022eb80;
                  _local_c28 = auVar19;
                  auVar182 = rcpps(auVar98,local_ab8);
                  fVar119 = auVar182._0_4_;
                  fVar150 = auVar182._4_4_;
                  fVar153 = auVar182._8_4_;
                  fVar140 = auVar182._12_4_;
                  fVar168 = (float)(-(uint)(1e-18 <= fVar168) &
                                   (uint)(((float)DAT_01f7ba10 - local_808 * fVar119) * fVar119 +
                                         fVar119));
                  fVar152 = (float)(-(uint)(1e-18 <= fVar152) &
                                   (uint)((DAT_01f7ba10._4_4_ - fStack_804 * fVar150) * fVar150 +
                                         fVar150));
                  fVar170 = (float)(-(uint)(1e-18 <= fVar170) &
                                   (uint)((DAT_01f7ba10._8_4_ - fStack_800 * fVar153) * fVar153 +
                                         fVar153));
                  fVar78 = (float)(-(uint)(1e-18 <= fVar78) &
                                  (uint)((DAT_01f7ba10._12_4_ - fStack_7fc * fVar140) * fVar140 +
                                        fVar140));
                  auVar66._0_4_ = (float)local_ad8._0_4_ * fVar168;
                  auVar66._4_4_ = (float)local_ad8._4_4_ * fVar152;
                  auVar66._8_4_ = fStack_ad0 * fVar170;
                  auVar66._12_4_ = fStack_acc * fVar78;
                  local_a88 = minps(auVar66,_DAT_01f7ba10);
                  auVar85._0_4_ = fVar128 * auVar98._0_4_ * fVar168;
                  auVar85._4_4_ = fVar128 * auVar98._4_4_ * fVar152;
                  auVar85._8_4_ = fVar128 * auVar98._8_4_ * fVar170;
                  auVar85._12_4_ = fVar128 * auVar98._12_4_ * fVar78;
                  local_a78 = minps(auVar85,_DAT_01f7ba10);
                  bVar40 = (byte)iVar41;
                  local_cb8 = (ulong)bVar40;
                  local_c88 = 0;
                  if ((ulong)bVar40 != 0) {
                    for (; (bVar40 >> local_c88 & 1) == 0; local_c88 = local_c88 + 1) {
                    }
                  }
                  local_c58 = (undefined1  [8])*(undefined8 *)((long)&(local_c10->org).field_0 + 8);
                  local_ca8 = (float)lVar50;
                  fStack_ca4 = (float)((ulong)lVar50 >> 0x20);
                  do {
                    local_bfc = *(undefined4 *)(local_a88 + local_c88 * 4);
                    local_bf8 = *(undefined4 *)(local_a78 + local_c88 * 4);
                    *(undefined4 *)&(local_c60->intersector1).intersect =
                         *(undefined4 *)(local_a68 + local_c88 * 4);
                    local_c08 = *(undefined4 *)(local_a58 + local_c88 * 4);
                    local_c04 = *(undefined4 *)(local_a48 + local_c88 * 4);
                    local_c00 = *(undefined4 *)(local_a38 + local_c88 * 4);
                    local_bf4 = (undefined4)local_ba8;
                    local_bf0 = (undefined4)local_c40;
                    local_bec = *(undefined4 *)local_c58;
                    local_be8 = *(undefined4 *)((long)local_c58 + 4);
                    local_cbc = -1;
                    local_bd8 = &local_cbc;
                    local_bd0 = *(undefined8 *)(lVar50 + 0x18);
                    local_bc8 = (undefined4 *)local_c58;
                    local_bc0 = local_c60;
                    local_bb8 = &local_c08;
                    local_bb0 = 1;
                    if (((*(code **)(lVar50 + 0x48) == (code *)0x0) ||
                        ((**(code **)(lVar50 + 0x48))(&local_bd8), *local_bd8 != 0)) &&
                       ((*(code **)(local_c98 + 0x10) == (code *)0x0 ||
                        ((((*local_c98 & 2) == 0 &&
                          ((*(byte *)(CONCAT44(fStack_ca4,local_ca8) + 0x3e) & 0x40) == 0)) ||
                         ((**(code **)(local_c98 + 0x10))(&local_bd8), *local_bd8 != 0))))))
                    goto LAB_0022eb80;
                    *(undefined4 *)&(local_c60->intersector1).intersect = local_c28._0_4_;
                    local_cb8 = local_cb8 ^ 1L << (local_c88 & 0x3f);
                    local_c88 = 0;
                    if (local_cb8 != 0) {
                      for (; (local_cb8 >> local_c88 & 1) == 0; local_c88 = local_c88 + 1) {
                      }
                    }
                    lVar50 = CONCAT44(fStack_ca4,local_ca8);
                  } while (local_cb8 != 0);
                  local_9b8 = *(float *)&local_c60->ptr;
                  local_9a8 = *(float *)((long)&local_c60->ptr + 4);
                  local_998 = *(float *)&local_c60->leafIntersector;
                  local_cb8._0_4_ = *(float *)&(local_c60->collider).collide;
                  local_c88._4_4_ = *(float *)((long)&(local_c60->collider).collide + 4);
                  fStack_c90 = *(float *)&(local_c60->collider).name;
                  local_cb8._4_4_ = (float)local_cb8;
                  fStack_cb0 = (float)local_cb8;
                  fStack_cac = (float)local_cb8;
                  fStack_9b4 = local_9b8;
                  fStack_9b0 = local_9b8;
                  fStack_9ac = local_9b8;
                  fStack_9a4 = local_9a8;
                  fStack_9a0 = local_9a8;
                  fStack_99c = local_9a8;
                  fStack_994 = local_998;
                  fStack_990 = local_998;
                  fStack_98c = local_998;
                  local_a28 = (local_8e8 - local_9b8) + ((float)local_b88 - local_9b8);
                  fStack_a24 = (fStack_8e4 - local_9b8) + (local_b88._4_4_ - local_9b8);
                  fStack_a20 = (fStack_8e0 - local_9b8) + (fStack_b80 - local_9b8);
                  fStack_a1c = (fStack_8dc - local_9b8) + (fStack_b7c - local_9b8);
                  local_9d8 = (local_8d8 - local_9a8) + (local_8c8 - local_9a8);
                  fStack_9d4 = (fStack_8d4 - local_9a8) + (fStack_8c4 - local_9a8);
                  fStack_9d0 = (fStack_8d0 - local_9a8) + (fStack_8c0 - local_9a8);
                  fStack_9cc = (fStack_8cc - local_9a8) + (fStack_8bc - local_9a8);
                  local_9e8 = ((float)local_8b8 - local_998) + ((float)local_8a8 - local_998);
                  fStack_9e4 = (local_8b8._4_4_ - local_998) + (local_8a8._4_4_ - local_998);
                  fStack_9e0 = (fStack_8b0 - local_998) + (fStack_8a0 - local_998);
                  fStack_9dc = (fStack_8ac - local_998) + (fStack_89c - local_998);
                  local_a08 = (float)local_8a8 - local_998;
                  fStack_a04 = local_8a8._4_4_ - local_998;
                  fStack_a00 = fStack_8a0 - local_998;
                  fStack_9fc = fStack_89c - local_998;
                  local_9f8 = local_8c8 - local_9a8;
                  fStack_9f4 = fStack_8c4 - local_9a8;
                  fStack_9f0 = fStack_8c0 - local_9a8;
                  fStack_9ec = fStack_8bc - local_9a8;
                  local_a18 = (float)local_b88 - local_9b8;
                  fStack_a14 = local_b88._4_4_ - local_9b8;
                  fStack_a10 = fStack_b80 - local_9b8;
                  fStack_a0c = fStack_b7c - local_9b8;
                  local_c28._4_4_ = local_8b8._4_4_ - local_998;
                  local_c28._0_4_ = (float)local_8b8 - local_998;
                  fStack_c20 = fStack_8b0 - local_998;
                  fStack_c1c = fStack_8ac - local_998;
                  local_c58._4_4_ = fStack_8d4 - local_9a8;
                  local_c58._0_4_ = local_8d8 - local_9a8;
                  fStack_c50 = fStack_8d0 - local_9a8;
                  fStack_c4c = fStack_8cc - local_9a8;
                  local_9c8 = local_8e8 - local_9b8;
                  fStack_9c4 = fStack_8e4 - local_9b8;
                  fStack_9c0 = fStack_8e0 - local_9b8;
                  fStack_9bc = fStack_8dc - local_9b8;
                  iVar41 = 0;
                  goto LAB_0022e316;
                }
              }
              fStack_cb0 = local_cb8._4_4_;
              local_c98 = (byte *)CONCAT44(fStack_c90,fStack_c90);
              fStack_c8c = fStack_c90;
              local_c38 = auVar174._8_4_ - fStack_98c;
              fStack_c34 = fStack_820 - fStack_98c;
              fStack_c30 = (fStack_810 * ((float)uStack_850 - (float)uStack_840) + (float)uStack_840
                           ) - fStack_98c;
              fStack_c2c = fStack_830 - fStack_98c;
              fVar168 = auVar174._0_4_ - fStack_9ac;
              fVar152 = local_828 - fStack_9ac;
              fVar170 = (local_818 * ((float)local_858 - (float)local_848) + (float)local_848) -
                        fStack_9ac;
              fVar78 = local_838 - fStack_9ac;
              local_b18 = auVar174._4_4_ - fStack_99c;
              fStack_b14 = fStack_824 - fStack_99c;
              fStack_b10 = (fStack_814 * (local_858._4_4_ - local_848._4_4_) + local_848._4_4_) -
                           fStack_99c;
              fStack_b0c = fStack_834 - fStack_99c;
              local_b08 = local_9f8 - local_b18;
              fStack_b04 = fStack_9f4 - fStack_b14;
              fStack_b00 = fStack_9f0 - fStack_b10;
              fStack_afc = fStack_9ec - fStack_b0c;
              fVar149 = local_a08 - local_c38;
              fVar180 = fStack_a04 - fStack_c34;
              fStack_b80 = fStack_a00 - fStack_c30;
              fStack_b7c = fStack_9fc - fStack_c2c;
              local_ca8 = (float)local_c58._0_4_ - local_9f8;
              fStack_ca4 = (float)local_c58._4_4_ - fStack_9f4;
              fStack_ca0 = fStack_c50 - fStack_9f0;
              fStack_c9c = fStack_c4c - fStack_9ec;
              fVar128 = (float)local_c28._0_4_ - local_a08;
              fVar119 = (float)local_c28._4_4_ - fStack_a04;
              fVar150 = fStack_c20 - fStack_a00;
              fVar153 = fStack_c1c - fStack_9fc;
              local_b28 = local_a18 - fVar168;
              fStack_b24 = fStack_a14 - fVar152;
              fStack_b20 = fStack_a10 - fVar170;
              fStack_b1c = fStack_a0c - fVar78;
              auVar99._0_4_ = local_9c8 - local_a18;
              auVar99._4_4_ = fStack_9c4 - fStack_a14;
              auVar99._8_4_ = fStack_9c0 - fStack_a10;
              auVar99._12_4_ = fStack_9bc - fStack_a0c;
              local_b88 = CONCAT44(fVar180,fVar149);
              fVar140 = (local_b08 * (local_a08 + local_c38) - fVar149 * (local_9f8 + local_b18)) *
                        local_cb8._4_4_ +
                        (fVar149 * (local_a18 + fVar168) - (local_a08 + local_c38) * local_b28) *
                        local_c88._4_4_ +
                        ((local_9f8 + local_b18) * local_b28 - (local_a18 + fVar168) * local_b08) *
                        fStack_c90;
              fVar124 = (fStack_b04 * (fStack_a04 + fStack_c34) -
                        fVar180 * (fStack_9f4 + fStack_b14)) * local_cb8._4_4_ +
                        (fVar180 * (fStack_a14 + fVar152) - (fStack_a04 + fStack_c34) * fStack_b24)
                        * local_c88._4_4_ +
                        ((fStack_9f4 + fStack_b14) * fStack_b24 -
                        (fStack_a14 + fVar152) * fStack_b04) * fStack_c90;
              local_b38 = (undefined1  [8])CONCAT44(fVar124,fVar140);
              fStack_b30 = (fStack_b00 * (fStack_a00 + fStack_c30) -
                           fStack_b80 * (fStack_9f0 + fStack_b10)) * local_cb8._4_4_ +
                           (fStack_b80 * (fStack_a10 + fVar170) -
                           (fStack_a00 + fStack_c30) * fStack_b20) * local_c88._4_4_ +
                           ((fStack_9f0 + fStack_b10) * fStack_b20 -
                           (fStack_a10 + fVar170) * fStack_b00) * fStack_c90;
              fStack_b2c = (fStack_afc * (fStack_9fc + fStack_c2c) -
                           fStack_b7c * (fStack_9ec + fStack_b0c)) * local_cb8._4_4_ +
                           (fStack_b7c * (fStack_a0c + fVar78) -
                           (fStack_9fc + fStack_c2c) * fStack_b1c) * local_c88._4_4_ +
                           ((fStack_9ec + fStack_b0c) * fStack_b1c -
                           (fStack_a0c + fVar78) * fStack_afc) * fStack_c90;
              fVar154 = local_b18 - (float)local_c58._0_4_;
              fVar160 = fStack_b14 - (float)local_c58._4_4_;
              fVar163 = fStack_b10 - fStack_c50;
              fVar94 = fStack_b0c - fStack_c4c;
              fVar125 = local_c38 - (float)local_c28._0_4_;
              fVar127 = fStack_c34 - (float)local_c28._4_4_;
              fVar151 = fStack_c30 - fStack_c20;
              fVar139 = fStack_c2c - fStack_c1c;
              fVar138 = fVar168 - local_9c8;
              fVar148 = fVar152 - fStack_9c4;
              fVar126 = fVar170 - fStack_9c0;
              fVar167 = fVar78 - fStack_9bc;
              local_b48._0_4_ =
                   (fVar154 * ((float)local_c28._0_4_ + local_c38) -
                   fVar125 * ((float)local_c58._0_4_ + local_b18)) * local_cb8._4_4_ +
                   (fVar125 * (local_9c8 + fVar168) - ((float)local_c28._0_4_ + local_c38) * fVar138
                   ) * local_c88._4_4_ +
                   (((float)local_c58._0_4_ + local_b18) * fVar138 - (local_9c8 + fVar168) * fVar154
                   ) * fStack_c90;
              local_b48._4_4_ =
                   (fVar160 * ((float)local_c28._4_4_ + fStack_c34) -
                   fVar127 * ((float)local_c58._4_4_ + fStack_b14)) * local_cb8._4_4_ +
                   (fVar127 * (fStack_9c4 + fVar152) -
                   ((float)local_c28._4_4_ + fStack_c34) * fVar148) * local_c88._4_4_ +
                   (((float)local_c58._4_4_ + fStack_b14) * fVar148 -
                   (fStack_9c4 + fVar152) * fVar160) * fStack_c90;
              fStack_b40 = (fVar163 * (fStack_c20 + fStack_c30) -
                           fVar151 * (fStack_c50 + fStack_b10)) * local_cb8._4_4_ +
                           (fVar151 * (fStack_9c0 + fVar170) - (fStack_c20 + fStack_c30) * fVar126)
                           * local_c88._4_4_ +
                           ((fStack_c50 + fStack_b10) * fVar126 - (fStack_9c0 + fVar170) * fVar163)
                           * fStack_c90;
              fStack_b3c = (fVar94 * (fStack_c1c + fStack_c2c) - fVar139 * (fStack_c4c + fStack_b0c)
                           ) * local_cb8._4_4_ +
                           (fVar139 * (fStack_9bc + fVar78) - (fStack_c1c + fStack_c2c) * fVar167) *
                           local_c88._4_4_ +
                           ((fStack_c4c + fStack_b0c) * fVar167 - (fStack_9bc + fVar78) * fVar94) *
                           fStack_c90;
              local_c58._4_4_ = fVar119;
              local_c58._0_4_ = fVar128;
              fStack_c50 = fVar150;
              fStack_c4c = fVar153;
              _local_c28 = auVar99;
              local_c88 = CONCAT44(local_c88._4_4_,local_c88._4_4_);
              fStack_c80 = local_c88._4_4_;
              fStack_c7c = local_c88._4_4_;
              auVar67._0_4_ =
                   (local_ca8 * local_9e8 - fVar128 * local_9d8) * local_cb8._4_4_ +
                   (fVar128 * local_a28 - local_9e8 * auVar99._0_4_) * local_c88._4_4_ +
                   (local_9d8 * auVar99._0_4_ - local_a28 * local_ca8) * fStack_c90;
              auVar67._4_4_ =
                   (fStack_ca4 * fStack_9e4 - fVar119 * fStack_9d4) * local_cb8._4_4_ +
                   (fVar119 * fStack_a24 - fStack_9e4 * auVar99._4_4_) * local_c88._4_4_ +
                   (fStack_9d4 * auVar99._4_4_ - fStack_a24 * fStack_ca4) * fStack_c90;
              auVar67._8_4_ =
                   (fStack_ca0 * fStack_9e0 - fVar150 * fStack_9d0) * local_cb8._4_4_ +
                   (fVar150 * fStack_a20 - fStack_9e0 * auVar99._8_4_) * local_c88._4_4_ +
                   (fStack_9d0 * auVar99._8_4_ - fStack_a20 * fStack_ca0) * fStack_c90;
              auVar67._12_4_ =
                   (fStack_c9c * fStack_9dc - fVar153 * fStack_9cc) * local_cb8._4_4_ +
                   (fVar153 * fStack_a1c - fStack_9dc * auVar99._12_4_) * local_c88._4_4_ +
                   (fStack_9cc * auVar99._12_4_ - fStack_a1c * fStack_c9c) * fStack_c90;
              local_b58._0_4_ = fVar140 + (float)local_b48._0_4_ + auVar67._0_4_;
              local_b58._4_4_ = fVar124 + (float)local_b48._4_4_ + auVar67._4_4_;
              fStack_b50 = fStack_b30 + fStack_b40 + auVar67._8_4_;
              fStack_b4c = fStack_b2c + fStack_b3c + auVar67._12_4_;
              auVar86._8_4_ = fStack_b30;
              auVar86._0_8_ = local_b38;
              auVar86._12_4_ = fStack_b2c;
              auVar182 = minps(auVar86,_local_b48);
              auVar182 = minps(auVar182,auVar67);
              auVar116._8_4_ = fStack_b30;
              auVar116._0_8_ = local_b38;
              auVar116._12_4_ = fStack_b2c;
              auVar181 = maxps(auVar116,_local_b48);
              auVar181 = maxps(auVar181,auVar67);
              local_b68 = ABS((float)local_b58._0_4_);
              fStack_b64 = ABS((float)local_b58._4_4_);
              fStack_b60 = ABS(fStack_b50);
              fStack_b5c = ABS(fStack_b4c);
              auVar117._4_4_ = -(uint)(auVar181._4_4_ <= fStack_b64 * 1.1920929e-07);
              auVar117._0_4_ = -(uint)(auVar181._0_4_ <= local_b68 * 1.1920929e-07);
              auVar117._8_4_ = -(uint)(auVar181._8_4_ <= fStack_b60 * 1.1920929e-07);
              auVar117._12_4_ = -(uint)(auVar181._12_4_ <= fStack_b5c * 1.1920929e-07);
              auVar87._4_4_ = -(uint)(-(fStack_b64 * 1.1920929e-07) <= auVar182._4_4_);
              auVar87._0_4_ = -(uint)(-(local_b68 * 1.1920929e-07) <= auVar182._0_4_);
              auVar87._8_4_ = -(uint)(-(fStack_b60 * 1.1920929e-07) <= auVar182._8_4_);
              auVar87._12_4_ = -(uint)(-(fStack_b5c * 1.1920929e-07) <= auVar182._12_4_);
              auVar117 = auVar117 | auVar87;
              auVar118._0_4_ = auVar117._0_4_ & local_988._0_4_;
              auVar118._4_4_ = auVar117._4_4_ & local_988._4_4_;
              auVar118._8_4_ = auVar117._8_4_ & local_988._8_4_;
              auVar118._12_4_ = auVar117._12_4_ & local_988._12_4_;
              iVar41 = movmskps(iVar41,auVar118);
              if (iVar41 != 0) {
                auVar183._0_4_ = local_b08 * fVar125 - fVar149 * fVar154;
                auVar183._4_4_ = fStack_b04 * fVar127 - fVar180 * fVar160;
                auVar183._8_4_ = fStack_b00 * fVar151 - fStack_b80 * fVar163;
                auVar183._12_4_ = fStack_afc * fVar139 - fStack_b7c * fVar94;
                auVar159._0_4_ = fVar154 * fVar128 - fVar125 * local_ca8;
                auVar159._4_4_ = fVar160 * fVar119 - fVar127 * fStack_ca4;
                auVar159._8_4_ = fVar163 * fVar150 - fVar151 * fStack_ca0;
                auVar159._12_4_ = fVar94 * fVar153 - fVar139 * fStack_c9c;
                auVar68._4_4_ = -(uint)(ABS(fVar180 * fVar160) < ABS(fVar127 * fStack_ca4));
                auVar68._0_4_ = -(uint)(ABS(fVar149 * fVar154) < ABS(fVar125 * local_ca8));
                auVar68._8_4_ = -(uint)(ABS(fStack_b80 * fVar163) < ABS(fVar151 * fStack_ca0));
                auVar68._12_4_ = -(uint)(ABS(fStack_b7c * fVar94) < ABS(fVar139 * fStack_c9c));
                local_a58 = blendvps(auVar159,auVar183,auVar68);
                auVar146._0_4_ = fVar149 * fVar138 - local_b28 * fVar125;
                auVar146._4_4_ = fVar180 * fVar148 - fStack_b24 * fVar127;
                auVar146._8_4_ = fStack_b80 * fVar126 - fStack_b20 * fVar151;
                auVar146._12_4_ = fStack_b7c * fVar167 - fStack_b1c * fVar139;
                auVar177._0_4_ = fVar125 * auVar99._0_4_ - fVar138 * fVar128;
                auVar177._4_4_ = fVar127 * auVar99._4_4_ - fVar148 * fVar119;
                auVar177._8_4_ = fVar151 * auVar99._8_4_ - fVar126 * fVar150;
                auVar177._12_4_ = fVar139 * auVar99._12_4_ - fVar167 * fVar153;
                auVar69._4_4_ = -(uint)(ABS(fStack_b24 * fVar127) < ABS(fVar148 * fVar119));
                auVar69._0_4_ = -(uint)(ABS(local_b28 * fVar125) < ABS(fVar138 * fVar128));
                auVar69._8_4_ = -(uint)(ABS(fStack_b20 * fVar151) < ABS(fVar126 * fVar150));
                auVar69._12_4_ = -(uint)(ABS(fStack_b1c * fVar139) < ABS(fVar167 * fVar153));
                local_a48 = blendvps(auVar177,auVar146,auVar69);
                auVar173._0_4_ = local_b28 * fVar154 - local_b08 * fVar138;
                auVar173._4_4_ = fStack_b24 * fVar160 - fStack_b04 * fVar148;
                auVar173._8_4_ = fStack_b20 * fVar163 - fStack_b00 * fVar126;
                auVar173._12_4_ = fStack_b1c * fVar94 - fStack_afc * fVar167;
                auVar176._0_4_ = fVar138 * local_ca8 - fVar154 * auVar99._0_4_;
                auVar176._4_4_ = fVar148 * fStack_ca4 - fVar160 * auVar99._4_4_;
                auVar176._8_4_ = fVar126 * fStack_ca0 - fVar163 * auVar99._8_4_;
                auVar176._12_4_ = fVar167 * fStack_c9c - fVar94 * auVar99._12_4_;
                auVar70._4_4_ = -(uint)(ABS(fStack_b04 * fVar148) < ABS(fVar160 * auVar99._4_4_));
                auVar70._0_4_ = -(uint)(ABS(local_b08 * fVar138) < ABS(fVar154 * auVar99._0_4_));
                auVar70._8_4_ = -(uint)(ABS(fStack_b00 * fVar126) < ABS(fVar163 * auVar99._8_4_));
                auVar70._12_4_ = -(uint)(ABS(fStack_afc * fVar167) < ABS(fVar94 * auVar99._12_4_));
                local_a38 = blendvps(auVar176,auVar173,auVar70);
                fVar128 = local_cb8._4_4_ * local_a58._0_4_ +
                          local_c88._4_4_ * local_a48._0_4_ + fStack_c90 * local_a38._0_4_;
                fVar119 = local_cb8._4_4_ * local_a58._4_4_ +
                          local_c88._4_4_ * local_a48._4_4_ + fStack_c90 * local_a38._4_4_;
                fVar150 = local_cb8._4_4_ * local_a58._8_4_ +
                          local_c88._4_4_ * local_a48._8_4_ + fStack_c90 * local_a38._8_4_;
                fVar153 = local_cb8._4_4_ * local_a58._12_4_ +
                          local_c88._4_4_ * local_a48._12_4_ + fStack_c90 * local_a38._12_4_;
                auVar178._0_4_ = fVar128 + fVar128;
                auVar178._4_4_ = fVar119 + fVar119;
                auVar178._8_4_ = fVar150 + fVar150;
                auVar178._12_4_ = fVar153 + fVar153;
                auVar88._0_4_ = local_c38 * local_a38._0_4_;
                auVar88._4_4_ = fStack_c34 * local_a38._4_4_;
                auVar88._8_4_ = fStack_c30 * local_a38._8_4_;
                auVar88._12_4_ = fStack_c2c * local_a38._12_4_;
                fVar128 = fVar168 * local_a58._0_4_ + local_b18 * local_a48._0_4_ + auVar88._0_4_;
                fVar119 = fVar152 * local_a58._4_4_ + fStack_b14 * local_a48._4_4_ + auVar88._4_4_;
                fVar150 = fVar170 * local_a58._8_4_ + fStack_b10 * local_a48._8_4_ + auVar88._8_4_;
                fVar153 = fVar78 * local_a58._12_4_ + fStack_b0c * local_a48._12_4_ + auVar88._12_4_
                ;
                auVar182 = rcpps(auVar88,auVar178);
                fVar168 = auVar182._0_4_;
                fVar152 = auVar182._4_4_;
                fVar170 = auVar182._8_4_;
                fVar78 = auVar182._12_4_;
                local_a68._0_4_ =
                     ((1.0 - auVar178._0_4_ * fVar168) * fVar168 + fVar168) * (fVar128 + fVar128);
                local_a68._4_4_ =
                     ((1.0 - auVar178._4_4_ * fVar152) * fVar152 + fVar152) * (fVar119 + fVar119);
                local_a68._8_4_ =
                     ((1.0 - auVar178._8_4_ * fVar170) * fVar170 + fVar170) * (fVar150 + fVar150);
                local_a68._12_4_ =
                     ((1.0 - auVar178._12_4_ * fVar78) * fVar78 + fVar78) * (fVar153 + fVar153);
                local_c58 = (undefined1  [8])(local_c60->intersector1).intersect;
                _fStack_c50 = (local_c60->intersector1).occluded;
                fVar152 = SUB84(local_c58,0);
                fVar168 = *(float *)((long)&local_c60->leafIntersector + 4);
                iVar55 = -(uint)(fVar168 <= local_a68._4_4_);
                iVar56 = -(uint)(fVar168 <= local_a68._8_4_);
                iVar57 = -(uint)(fVar168 <= local_a68._12_4_);
                auVar89._8_4_ = iVar56;
                auVar89._4_4_ = iVar55;
                auVar89._12_4_ = iVar57;
                auVar179._0_4_ =
                     (int)((uint)(auVar178._0_4_ != 0.0 &&
                                 (local_a68._0_4_ <= fVar152 && fVar168 <= local_a68._0_4_)) *
                          -0x80000000) >> 0x1f;
                auVar179._4_4_ =
                     (int)((uint)(auVar178._4_4_ != 0.0 &&
                                 (local_a68._4_4_ <= fVar152 && fVar168 <= local_a68._4_4_)) *
                          -0x80000000) >> 0x1f;
                auVar179._8_4_ =
                     (int)((uint)(auVar178._8_4_ != 0.0 &&
                                 (local_a68._8_4_ <= fVar152 && fVar168 <= local_a68._8_4_)) *
                          -0x80000000) >> 0x1f;
                auVar179._12_4_ =
                     (int)((uint)(auVar178._12_4_ != 0.0 &&
                                 (local_a68._12_4_ <= fVar152 && fVar168 <= local_a68._12_4_)) *
                          -0x80000000) >> 0x1f;
                uVar44 = movmskps(iVar41,auVar179 & auVar118);
                if (uVar44 != 0) {
                  uVar46 = extractps(_local_c58,1);
                  local_ab8 = _local_b58;
                  local_aa8 = &local_cbd;
                  local_a98 = auVar179 & auVar118;
                  auVar100._0_4_ = (float)local_b58._0_4_ - (float)local_b48._0_4_;
                  auVar100._4_4_ = (float)local_b58._4_4_ - (float)local_b48._4_4_;
                  auVar100._8_4_ = fStack_b50 - fStack_b40;
                  auVar100._12_4_ = fStack_b4c - fStack_b3c;
                  auVar89._0_4_ = (float)(int)(*(ushort *)(local_b98 + 8 + local_ba0) - 1);
                  auVar133._4_4_ = iVar55;
                  auVar133._0_4_ = auVar89._0_4_;
                  auVar133._8_4_ = iVar56;
                  auVar133._12_4_ = iVar57;
                  auVar182 = rcpss(auVar133,auVar89);
                  auVar147._4_12_ = auVar146._4_12_;
                  auVar147._0_4_ = (float)(int)(*(ushort *)(local_b98 + 10 + local_ba0) - 1);
                  fVar168 = (2.0 - auVar89._0_4_ * auVar182._0_4_) * auVar182._0_4_;
                  auVar134._4_4_ = auVar146._4_4_;
                  auVar134._0_4_ = auVar147._0_4_;
                  auVar134._8_4_ = auVar146._8_4_;
                  auVar134._12_4_ = auVar146._12_4_;
                  auVar182 = rcpss(auVar134,auVar147);
                  fVar152 = (2.0 - auVar147._0_4_ * auVar182._0_4_) * auVar182._0_4_;
                  local_ad8._0_4_ =
                       fVar168 * ((float)(int)local_978._0_4_ * (float)local_b58._0_4_ +
                                 ((float)local_b58._0_4_ - fVar140));
                  local_ad8._4_4_ =
                       fVar168 * ((float)(local_978._0_4_ + 1) * (float)local_b58._4_4_ +
                                 ((float)local_b58._4_4_ - fVar124));
                  fStack_ad0 = fVar168 * ((float)(local_978._0_4_ + 1) * fStack_b50 +
                                         (fStack_b50 - fStack_b30));
                  fStack_acc = fVar168 * ((float)(int)local_978._0_4_ * fStack_b4c +
                                         (fStack_b4c - fStack_b2c));
                  local_ac8._0_4_ =
                       fVar152 * ((float)(int)local_b78._0_4_ * (float)local_b58._0_4_ +
                                 auVar100._0_4_);
                  local_ac8._4_4_ =
                       fVar152 * ((float)(int)local_b78._0_4_ * (float)local_b58._4_4_ +
                                 auVar100._4_4_);
                  fStack_ac0 = fVar152 * ((float)(local_b78._0_4_ + 1) * fStack_b50 + auVar100._8_4_
                                         );
                  fStack_abc = fVar152 * ((float)(local_b78._0_4_ + 1) * fStack_b4c +
                                         auVar100._12_4_);
                  lVar50 = *(long *)(*(long *)(local_b90 + 0x1e8) + local_c40 * 8);
                  if ((*(uint *)(lVar50 + 0x34) & (uint)uVar46) != 0) {
                    local_c98 = *(byte **)&(local_c10->dir).field_0;
                    if ((*(long *)(local_c98 + 0x10) == 0) && (*(long *)(lVar50 + 0x48) == 0)) {
LAB_0022eb80:
                      *(undefined4 *)&(local_c60->intersector1).intersect = 0xff800000;
                      return;
                    }
                    auVar182 = rcpps(auVar100,_local_b58);
                    fVar168 = auVar182._0_4_;
                    fVar152 = auVar182._4_4_;
                    fVar170 = auVar182._8_4_;
                    fVar78 = auVar182._12_4_;
                    fVar168 = (float)(-(uint)(1e-18 <= local_b68) &
                                     (uint)(((float)DAT_01f7ba10 - (float)local_b58._0_4_ * fVar168)
                                            * fVar168 + fVar168));
                    fVar152 = (float)(-(uint)(1e-18 <= fStack_b64) &
                                     (uint)((DAT_01f7ba10._4_4_ - (float)local_b58._4_4_ * fVar152)
                                            * fVar152 + fVar152));
                    fVar170 = (float)(-(uint)(1e-18 <= fStack_b60) &
                                     (uint)((DAT_01f7ba10._8_4_ - fStack_b50 * fVar170) * fVar170 +
                                           fVar170));
                    fVar78 = (float)(-(uint)(1e-18 <= fStack_b5c) &
                                    (uint)((DAT_01f7ba10._12_4_ - fStack_b4c * fVar78) * fVar78 +
                                          fVar78));
                    auVar71._0_4_ = (float)local_ad8._0_4_ * fVar168;
                    auVar71._4_4_ = (float)local_ad8._4_4_ * fVar152;
                    auVar71._8_4_ = fStack_ad0 * fVar170;
                    auVar71._12_4_ = fStack_acc * fVar78;
                    local_a88 = minps(auVar71,_DAT_01f7ba10);
                    auVar90._0_4_ = (float)local_ac8._0_4_ * fVar168;
                    auVar90._4_4_ = (float)local_ac8._4_4_ * fVar152;
                    auVar90._8_4_ = fStack_ac0 * fVar170;
                    auVar90._12_4_ = fStack_abc * fVar78;
                    local_a78 = minps(auVar90,_DAT_01f7ba10);
                    uVar44 = uVar44 & 0xff;
                    local_cb8 = (ulong)uVar44;
                    local_c88 = 0;
                    if ((ulong)uVar44 != 0) {
                      for (; (uVar44 >> local_c88 & 1) == 0; local_c88 = local_c88 + 1) {
                      }
                    }
                    uVar46 = *(undefined8 *)((long)&(local_c10->org).field_0 + 8);
                    local_c38 = (float)uVar46;
                    fStack_c34 = (float)((ulong)uVar46 >> 0x20);
                    local_ca8 = (float)lVar50;
                    fStack_ca4 = (float)((ulong)lVar50 >> 0x20);
                    fStack_cac = fStack_cb0;
                    local_9b8 = fStack_9ac;
                    fStack_9b4 = fStack_9ac;
                    fStack_9b0 = fStack_9ac;
                    local_9a8 = fStack_99c;
                    fStack_9a4 = fStack_99c;
                    fStack_9a0 = fStack_99c;
                    local_998 = fStack_98c;
                    fStack_994 = fStack_98c;
                    fStack_990 = fStack_98c;
                    do {
                      local_bfc = *(undefined4 *)(local_a88 + local_c88 * 4);
                      local_bf8 = *(undefined4 *)(local_a78 + local_c88 * 4);
                      *(undefined4 *)&(local_c60->intersector1).intersect =
                           *(undefined4 *)(local_a68 + local_c88 * 4);
                      local_c08 = *(undefined4 *)(local_a58 + local_c88 * 4);
                      local_c04 = *(undefined4 *)(local_a48 + local_c88 * 4);
                      local_c00 = *(undefined4 *)(local_a38 + local_c88 * 4);
                      local_bf4 = (undefined4)local_ba8;
                      local_bf0 = (undefined4)local_c40;
                      local_bc8 = (undefined4 *)CONCAT44(fStack_c34,local_c38);
                      local_bec = *local_bc8;
                      local_be8 = local_bc8[1];
                      local_cbc = -1;
                      local_bd8 = &local_cbc;
                      local_bd0 = *(undefined8 *)(lVar50 + 0x18);
                      local_bb8 = &local_c08;
                      local_bb0 = 1;
                      local_bc0 = local_c60;
                      if (((*(code **)(lVar50 + 0x48) == (code *)0x0) ||
                          ((**(code **)(lVar50 + 0x48))(&local_bd8), *local_bd8 != 0)) &&
                         ((*(code **)(local_c98 + 0x10) == (code *)0x0 ||
                          ((((*local_c98 & 2) == 0 &&
                            ((*(byte *)(CONCAT44(fStack_ca4,local_ca8) + 0x3e) & 0x40) == 0)) ||
                           ((**(code **)(local_c98 + 0x10))(&local_bd8), *local_bd8 != 0))))))
                      goto LAB_0022eb80;
                      *(undefined4 *)&(local_c60->intersector1).intersect = local_c58._0_4_;
                      local_cb8 = local_cb8 ^ 1L << (local_c88 & 0x3f);
                      local_c88 = 0;
                      if (local_cb8 != 0) {
                        for (; (local_cb8 >> local_c88 & 1) == 0; local_c88 = local_c88 + 1) {
                        }
                      }
                      lVar50 = CONCAT44(fStack_ca4,local_ca8);
                    } while (local_cb8 != 0);
                  }
                }
              }
              local_ae8 = local_ae8 & local_ae8 - 1;
            } while (local_ae8 != 0);
          }
          local_ae0 = (RayQueryContext *)((long)&local_ae0->scene + 1);
          fVar170 = local_948;
          fVar168 = fStack_944;
          fVar78 = fStack_940;
          fVar128 = fStack_93c;
          fVar119 = local_958;
          fVar150 = fStack_954;
          fVar153 = fStack_950;
          fVar140 = fStack_94c;
          fVar124 = local_968;
          fVar154 = fStack_964;
          fVar160 = fStack_960;
          fVar163 = fStack_95c;
          fVar152 = local_938;
          fVar94 = fStack_934;
          fVar138 = fStack_930;
          fVar148 = fStack_92c;
          fVar126 = local_928;
          fVar167 = fStack_924;
          fVar125 = fStack_920;
          fVar127 = fStack_91c;
          fVar180 = local_908;
          fVar151 = fStack_904;
          fVar139 = fStack_900;
          fVar149 = fStack_8fc;
          fVar184 = local_918;
          fVar155 = fStack_914;
          fVar156 = fStack_910;
          fVar157 = fStack_90c;
        } while (local_ae0 != local_af0);
      }
LAB_0022eb70:
      context = local_af0;
    } while (local_c68 != &local_7d8);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }